

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersector1<4>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined8 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  long lVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [28];
  uint uVar92;
  uint uVar93;
  ulong uVar94;
  uint uVar95;
  ulong uVar96;
  ulong uVar97;
  Primitive *pPVar98;
  Geometry *pGVar99;
  ulong uVar100;
  long lVar101;
  undefined4 uVar102;
  undefined8 uVar103;
  float fVar120;
  vint4 bi_2;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar119;
  float fVar121;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar108 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  vint4 bi_1;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 ai_2;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar160 [64];
  vint4 ai;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 bi;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined4 uVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [64];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar219;
  float fVar221;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar223;
  float fVar224;
  undefined8 uVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar217 [32];
  undefined8 uVar222;
  undefined8 uVar228;
  undefined1 auVar218 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_78c;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [48];
  undefined1 local_6d0 [8];
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  Precalculations *local_6a0;
  Primitive *local_698;
  RTCFilterFunctionNArguments local_690;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined8 local_610;
  undefined4 local_608;
  float local_604;
  undefined4 local_600;
  uint local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [2] [32];
  Geometry *local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [32];
  undefined8 local_460;
  undefined8 uStack_458;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  int local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar100 = (ulong)(byte)PVar8;
  lVar79 = uVar100 * 0x19;
  fVar141 = *(float *)(prim + lVar79 + 0x12);
  auVar165 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar79 + 6));
  auVar104._0_4_ = fVar141 * auVar165._0_4_;
  auVar104._4_4_ = fVar141 * auVar165._4_4_;
  auVar104._8_4_ = fVar141 * auVar165._8_4_;
  auVar104._12_4_ = fVar141 * auVar165._12_4_;
  auVar174._0_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar174._4_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar174._8_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar174._12_4_ = fVar141 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 4 + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar100 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar100 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar96 = (ulong)(uint)((int)(uVar100 * 9) * 2);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + uVar100 + 6)));
  auVar106 = vcvtdq2ps_avx(auVar106);
  uVar96 = (ulong)(uint)((int)(uVar100 * 5) << 2);
  auVar142 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar96 + 6)));
  auVar142 = vcvtdq2ps_avx(auVar142);
  auVar215._4_4_ = auVar174._0_4_;
  auVar215._0_4_ = auVar174._0_4_;
  auVar215._8_4_ = auVar174._0_4_;
  auVar215._12_4_ = auVar174._0_4_;
  auVar126 = vshufps_avx(auVar174,auVar174,0x55);
  auVar105 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar141 = auVar105._0_4_;
  auVar205._0_4_ = fVar141 * auVar13._0_4_;
  fVar140 = auVar105._4_4_;
  auVar205._4_4_ = fVar140 * auVar13._4_4_;
  fVar119 = auVar105._8_4_;
  auVar205._8_4_ = fVar119 * auVar13._8_4_;
  fVar120 = auVar105._12_4_;
  auVar205._12_4_ = fVar120 * auVar13._12_4_;
  auVar201._0_4_ = auVar16._0_4_ * fVar141;
  auVar201._4_4_ = auVar16._4_4_ * fVar140;
  auVar201._8_4_ = auVar16._8_4_ * fVar119;
  auVar201._12_4_ = auVar16._12_4_ * fVar120;
  auVar191._0_4_ = auVar142._0_4_ * fVar141;
  auVar191._4_4_ = auVar142._4_4_ * fVar140;
  auVar191._8_4_ = auVar142._8_4_ * fVar119;
  auVar191._12_4_ = auVar142._12_4_ * fVar120;
  auVar105 = vfmadd231ps_fma(auVar205,auVar126,auVar12);
  auVar127 = vfmadd231ps_fma(auVar201,auVar126,auVar15);
  auVar126 = vfmadd231ps_fma(auVar191,auVar106,auVar126);
  auVar155 = vfmadd231ps_fma(auVar105,auVar215,auVar165);
  auVar127 = vfmadd231ps_fma(auVar127,auVar215,auVar14);
  auVar162 = vfmadd231ps_fma(auVar126,auVar107,auVar215);
  auVar216._4_4_ = auVar104._0_4_;
  auVar216._0_4_ = auVar104._0_4_;
  auVar216._8_4_ = auVar104._0_4_;
  auVar216._12_4_ = auVar104._0_4_;
  auVar126 = vshufps_avx(auVar104,auVar104,0x55);
  auVar105 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar141 = auVar105._0_4_;
  auVar175._0_4_ = fVar141 * auVar13._0_4_;
  fVar140 = auVar105._4_4_;
  auVar175._4_4_ = fVar140 * auVar13._4_4_;
  fVar119 = auVar105._8_4_;
  auVar175._8_4_ = fVar119 * auVar13._8_4_;
  fVar120 = auVar105._12_4_;
  auVar175._12_4_ = fVar120 * auVar13._12_4_;
  auVar125._0_4_ = auVar16._0_4_ * fVar141;
  auVar125._4_4_ = auVar16._4_4_ * fVar140;
  auVar125._8_4_ = auVar16._8_4_ * fVar119;
  auVar125._12_4_ = auVar16._12_4_ * fVar120;
  auVar105._0_4_ = auVar142._0_4_ * fVar141;
  auVar105._4_4_ = auVar142._4_4_ * fVar140;
  auVar105._8_4_ = auVar142._8_4_ * fVar119;
  auVar105._12_4_ = auVar142._12_4_ * fVar120;
  auVar12 = vfmadd231ps_fma(auVar175,auVar126,auVar12);
  auVar13 = vfmadd231ps_fma(auVar125,auVar126,auVar15);
  auVar15 = vfmadd231ps_fma(auVar105,auVar126,auVar106);
  auVar16 = vfmadd231ps_fma(auVar12,auVar216,auVar165);
  auVar106 = vfmadd231ps_fma(auVar13,auVar216,auVar14);
  auVar142 = vfmadd231ps_fma(auVar15,auVar216,auVar107);
  local_270._8_4_ = 0x7fffffff;
  local_270._0_8_ = 0x7fffffff7fffffff;
  local_270._12_4_ = 0x7fffffff;
  auVar165 = vandps_avx(auVar155,local_270);
  auVar161._8_4_ = 0x219392ef;
  auVar161._0_8_ = 0x219392ef219392ef;
  auVar161._12_4_ = 0x219392ef;
  auVar165 = vcmpps_avx(auVar165,auVar161,1);
  auVar12 = vblendvps_avx(auVar155,auVar161,auVar165);
  auVar165 = vandps_avx(auVar127,local_270);
  auVar165 = vcmpps_avx(auVar165,auVar161,1);
  auVar13 = vblendvps_avx(auVar127,auVar161,auVar165);
  auVar165 = vandps_avx(auVar162,local_270);
  auVar165 = vcmpps_avx(auVar165,auVar161,1);
  auVar165 = vblendvps_avx(auVar162,auVar161,auVar165);
  auVar14 = vrcpps_avx(auVar12);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = 0x3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar187);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar187);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar165);
  auVar165 = vfnmadd213ps_fma(auVar165,auVar12,auVar187);
  auVar107 = vfmadd132ps_fma(auVar165,auVar12,auVar12);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar100 * 7 + 6);
  auVar165 = vpmovsxwd_avx(auVar165);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar16);
  auVar162._0_4_ = auVar14._0_4_ * auVar165._0_4_;
  auVar162._4_4_ = auVar14._4_4_ * auVar165._4_4_;
  auVar162._8_4_ = auVar14._8_4_ * auVar165._8_4_;
  auVar162._12_4_ = auVar14._12_4_ * auVar165._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar100 * 9 + 6);
  auVar165 = vpmovsxwd_avx(auVar12);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar16);
  auVar176._0_4_ = auVar14._0_4_ * auVar165._0_4_;
  auVar176._4_4_ = auVar14._4_4_ * auVar165._4_4_;
  auVar176._8_4_ = auVar14._8_4_ * auVar165._8_4_;
  auVar176._12_4_ = auVar14._12_4_ * auVar165._12_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar100 * -2 + 6);
  auVar165 = vpmovsxwd_avx(auVar14);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar106);
  auVar192._0_4_ = auVar165._0_4_ * auVar15._0_4_;
  auVar192._4_4_ = auVar165._4_4_ * auVar15._4_4_;
  auVar192._8_4_ = auVar165._8_4_ * auVar15._8_4_;
  auVar192._12_4_ = auVar165._12_4_ * auVar15._12_4_;
  auVar165 = vcvtdq2ps_avx(auVar12);
  auVar165 = vsubps_avx(auVar165,auVar106);
  auVar126._0_4_ = auVar15._0_4_ * auVar165._0_4_;
  auVar126._4_4_ = auVar15._4_4_ * auVar165._4_4_;
  auVar126._8_4_ = auVar15._8_4_ * auVar165._8_4_;
  auVar126._12_4_ = auVar15._12_4_ * auVar165._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar96 + uVar100 + 6);
  auVar165 = vpmovsxwd_avx(auVar15);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar155._0_4_ = auVar107._0_4_ * auVar165._0_4_;
  auVar155._4_4_ = auVar107._4_4_ * auVar165._4_4_;
  auVar155._8_4_ = auVar107._8_4_ * auVar165._8_4_;
  auVar155._12_4_ = auVar107._12_4_ * auVar165._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar100 * 0x17 + 6);
  auVar165 = vpmovsxwd_avx(auVar16);
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar165 = vsubps_avx(auVar165,auVar142);
  auVar106._0_4_ = auVar107._0_4_ * auVar165._0_4_;
  auVar106._4_4_ = auVar107._4_4_ * auVar165._4_4_;
  auVar106._8_4_ = auVar107._8_4_ * auVar165._8_4_;
  auVar106._12_4_ = auVar107._12_4_ * auVar165._12_4_;
  auVar165 = vpminsd_avx(auVar162,auVar176);
  auVar12 = vpminsd_avx(auVar192,auVar126);
  auVar165 = vmaxps_avx(auVar165,auVar12);
  auVar12 = vpminsd_avx(auVar155,auVar106);
  uVar102 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar195._4_4_ = uVar102;
  auVar195._0_4_ = uVar102;
  auVar195._8_4_ = uVar102;
  auVar195._12_4_ = uVar102;
  auVar12 = vmaxps_avx(auVar12,auVar195);
  auVar165 = vmaxps_avx(auVar165,auVar12);
  local_280._0_4_ = auVar165._0_4_ * 0.99999964;
  local_280._4_4_ = auVar165._4_4_ * 0.99999964;
  local_280._8_4_ = auVar165._8_4_ * 0.99999964;
  local_280._12_4_ = auVar165._12_4_ * 0.99999964;
  auVar165 = vpmaxsd_avx(auVar162,auVar176);
  auVar12 = vpmaxsd_avx(auVar192,auVar126);
  auVar165 = vminps_avx(auVar165,auVar12);
  auVar12 = vpmaxsd_avx(auVar155,auVar106);
  fVar141 = (ray->super_RayK<1>).tfar;
  auVar142._4_4_ = fVar141;
  auVar142._0_4_ = fVar141;
  auVar142._8_4_ = fVar141;
  auVar142._12_4_ = fVar141;
  auVar12 = vminps_avx(auVar12,auVar142);
  auVar165 = vminps_avx(auVar165,auVar12);
  auVar107._0_4_ = auVar165._0_4_ * 1.0000004;
  auVar107._4_4_ = auVar165._4_4_ * 1.0000004;
  auVar107._8_4_ = auVar165._8_4_ * 1.0000004;
  auVar107._12_4_ = auVar165._12_4_ * 1.0000004;
  auVar127[4] = PVar8;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar8;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar8;
  auVar127._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar127,_DAT_01f7fcf0);
  auVar165 = vcmpps_avx(local_280,auVar107,2);
  auVar165 = vandps_avx(auVar165,auVar12);
  uVar95 = vmovmskps_avx(auVar165);
  if (uVar95 != 0) {
    uVar95 = uVar95 & 0xff;
    local_520[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_520[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_520[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_520[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_698 = prim;
    local_6a0 = pre;
    pPVar98 = prim;
    do {
      auVar184 = local_760;
      lVar21 = 0;
      uVar100 = (ulong)uVar95;
      for (uVar96 = uVar100; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar100 = uVar100 - 1 & uVar100;
      uVar95 = *(uint *)(pPVar98 + lVar21 * 4 + 6);
      uVar94 = (ulong)(uint)((int)lVar21 << 6);
      uVar9 = *(uint *)(pPVar98 + 2);
      uVar96 = (ulong)uVar9;
      local_4e0 = (context->scene->geometries).items[uVar96].ptr;
      pPVar1 = prim + uVar94 + lVar79 + 0x16;
      local_730 = *(undefined8 *)pPVar1;
      uStack_728 = *(undefined8 *)(pPVar1 + 8);
      if (uVar100 != 0) {
        uVar97 = uVar100 - 1 & uVar100;
        for (uVar22 = uVar100; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar97 != 0) {
          for (; (uVar97 & 1) == 0; uVar97 = uVar97 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_6b0 = *(undefined1 (*) [16])(prim + uVar94 + lVar79 + 0x26);
      auVar155 = local_6b0;
      local_6c0 = *(undefined1 (*) [16])(prim + uVar94 + lVar79 + 0x36);
      _local_6d0 = *(undefined1 (*) [16])(prim + uVar94 + lVar79 + 0x46);
      local_1fc = (int)local_4e0[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                       _M_i;
      aVar5 = (ray->super_RayK<1>).org.field_0;
      auVar12 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar5);
      uVar102 = auVar12._0_4_;
      auVar156._4_4_ = uVar102;
      auVar156._0_4_ = uVar102;
      auVar156._8_4_ = uVar102;
      auVar156._12_4_ = uVar102;
      auVar165 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar6 = (pre->ray_space).vx.field_0;
      aVar7 = (pre->ray_space).vy.field_0;
      fVar141 = (pre->ray_space).vz.field_0.m128[0];
      fVar140 = (pre->ray_space).vz.field_0.m128[1];
      fVar119 = (pre->ray_space).vz.field_0.m128[2];
      fVar120 = (pre->ray_space).vz.field_0.m128[3];
      auVar202._0_4_ = auVar12._0_4_ * fVar141;
      auVar202._4_4_ = auVar12._4_4_ * fVar140;
      auVar202._8_4_ = auVar12._8_4_ * fVar119;
      auVar202._12_4_ = auVar12._12_4_ * fVar120;
      auVar165 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar7,auVar165);
      auVar16 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar6,auVar156);
      auVar165 = vblendps_avx(auVar16,*(undefined1 (*) [16])pPVar1,8);
      auVar13 = vsubps_avx(local_6b0,(undefined1  [16])aVar5);
      uVar102 = auVar13._0_4_;
      auVar177._4_4_ = uVar102;
      auVar177._0_4_ = uVar102;
      auVar177._8_4_ = uVar102;
      auVar177._12_4_ = uVar102;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar196._0_4_ = auVar13._0_4_ * fVar141;
      auVar196._4_4_ = auVar13._4_4_ * fVar140;
      auVar196._8_4_ = auVar13._8_4_ * fVar119;
      auVar196._12_4_ = auVar13._12_4_ * fVar120;
      auVar12 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar7,auVar12);
      auVar107 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar6,auVar177);
      auVar12 = vblendps_avx(auVar107,local_6b0,8);
      auVar127 = local_6c0;
      auVar14 = vsubps_avx(local_6c0,(undefined1  [16])aVar5);
      uVar102 = auVar14._0_4_;
      auVar181._4_4_ = uVar102;
      auVar181._0_4_ = uVar102;
      auVar181._8_4_ = uVar102;
      auVar181._12_4_ = uVar102;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar206._0_4_ = auVar14._0_4_ * fVar141;
      auVar206._4_4_ = auVar14._4_4_ * fVar140;
      auVar206._8_4_ = auVar14._8_4_ * fVar119;
      auVar206._12_4_ = auVar14._12_4_ * fVar120;
      auVar13 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar7,auVar13);
      auVar106 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar6,auVar181);
      auVar13 = vblendps_avx(auVar106,local_6c0,8);
      local_4c0._0_16_ = (undefined1  [16])aVar5;
      auVar105 = _local_6d0;
      auVar15 = vsubps_avx(_local_6d0,(undefined1  [16])aVar5);
      uVar102 = auVar15._0_4_;
      auVar188._4_4_ = uVar102;
      auVar188._0_4_ = uVar102;
      auVar188._8_4_ = uVar102;
      auVar188._12_4_ = uVar102;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar143._0_4_ = auVar15._0_4_ * fVar141;
      auVar143._4_4_ = auVar15._4_4_ * fVar140;
      auVar143._8_4_ = auVar15._8_4_ * fVar119;
      auVar143._12_4_ = auVar15._12_4_ * fVar120;
      auVar14 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar7,auVar14);
      auVar142 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar6,auVar188);
      auVar14 = vblendps_avx(auVar142,_local_6d0,8);
      auVar165 = vandps_avx(auVar165,local_270);
      auVar12 = vandps_avx(auVar12,local_270);
      auVar15 = vmaxps_avx(auVar165,auVar12);
      auVar165 = vandps_avx(auVar13,local_270);
      auVar12 = vandps_avx(auVar14,local_270);
      auVar165 = vmaxps_avx(auVar165,auVar12);
      auVar165 = vmaxps_avx(auVar15,auVar165);
      auVar12 = vmovshdup_avx(auVar165);
      auVar12 = vmaxss_avx(auVar12,auVar165);
      auVar165 = vshufpd_avx(auVar165,auVar165,1);
      auVar165 = vmaxss_avx(auVar165,auVar12);
      local_760._0_4_ = auVar165._0_4_;
      lVar21 = (long)local_1fc * 0x44;
      auVar12 = vmovshdup_avx(auVar16);
      uVar103 = auVar12._0_8_;
      local_420._8_8_ = uVar103;
      local_420._0_8_ = uVar103;
      local_420._16_8_ = uVar103;
      local_420._24_8_ = uVar103;
      auVar13 = vmovshdup_avx(auVar107);
      uVar103 = auVar13._0_8_;
      local_440._8_8_ = uVar103;
      local_440._0_8_ = uVar103;
      local_440._16_8_ = uVar103;
      local_440._24_8_ = uVar103;
      auVar182 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar204 = auVar106._0_4_;
      local_5a0._4_4_ = uVar204;
      local_5a0._0_4_ = uVar204;
      local_5a0._8_4_ = uVar204;
      local_5a0._12_4_ = uVar204;
      local_5a0._16_4_ = uVar204;
      local_5a0._20_4_ = uVar204;
      local_5a0._24_4_ = uVar204;
      local_5a0._28_4_ = uVar204;
      auVar13 = vmovshdup_avx(auVar106);
      uVar103 = auVar13._0_8_;
      local_540._8_8_ = uVar103;
      local_540._0_8_ = uVar103;
      local_540._16_8_ = uVar103;
      local_540._24_8_ = uVar103;
      fVar119 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      fVar120 = *(float *)(bspline_basis0 + lVar21 + 0xd90);
      fVar121 = *(float *)(bspline_basis0 + lVar21 + 0xd94);
      fVar122 = *(float *)(bspline_basis0 + lVar21 + 0xd98);
      fVar123 = *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      fVar124 = *(float *)(bspline_basis0 + lVar21 + 0xda0);
      fVar214 = *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar91 = *(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      auVar13 = vmovshdup_avx(auVar142);
      local_3e0 = auVar13._0_8_;
      local_400 = auVar142._0_4_;
      auVar115._0_4_ = fVar119 * local_400;
      auVar115._4_4_ = fVar120 * local_400;
      auVar115._8_4_ = fVar121 * local_400;
      auVar115._12_4_ = fVar122 * local_400;
      auVar115._16_4_ = fVar123 * local_400;
      auVar115._20_4_ = fVar124 * local_400;
      auVar115._24_4_ = fVar214 * local_400;
      auVar115._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar115,auVar182,local_5a0);
      fVar212 = auVar13._0_4_;
      auVar132._0_4_ = fVar212 * fVar119;
      fVar219 = auVar13._4_4_;
      auVar132._4_4_ = fVar219 * fVar120;
      auVar132._8_4_ = fVar212 * fVar121;
      auVar132._12_4_ = fVar219 * fVar122;
      auVar132._16_4_ = fVar212 * fVar123;
      auVar132._20_4_ = fVar219 * fVar124;
      auVar132._24_4_ = fVar212 * fVar214;
      auVar132._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar132,auVar182,local_540);
      auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar102 = auVar107._0_4_;
      local_560._4_4_ = uVar102;
      local_560._0_4_ = uVar102;
      local_560._8_4_ = uVar102;
      local_560._12_4_ = uVar102;
      local_560._16_4_ = uVar102;
      local_560._20_4_ = uVar102;
      local_560._24_4_ = uVar102;
      local_560._28_4_ = uVar102;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,local_560);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar115,local_440);
      auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      auVar203._0_4_ = auVar16._0_4_;
      auVar203._4_4_ = auVar203._0_4_;
      auVar203._8_4_ = auVar203._0_4_;
      auVar203._12_4_ = auVar203._0_4_;
      auVar203._16_4_ = auVar203._0_4_;
      auVar203._20_4_ = auVar203._0_4_;
      auVar203._24_4_ = auVar203._0_4_;
      auVar203._28_4_ = auVar203._0_4_;
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar132,auVar203);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar132,local_420);
      auVar200 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar80 = *(float *)(bspline_basis1 + lVar21 + 0xd8c);
      fVar81 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar82 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar83 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar84 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar85 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar86 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      fStack_3fc = local_400;
      fStack_3f8 = local_400;
      fStack_3f4 = local_400;
      fStack_3f0 = local_400;
      fStack_3ec = local_400;
      fStack_3e8 = local_400;
      fStack_3e4 = local_400;
      auVar193._4_4_ = fVar81 * local_400;
      auVar193._0_4_ = fVar80 * local_400;
      auVar193._8_4_ = fVar82 * local_400;
      auVar193._12_4_ = fVar83 * local_400;
      auVar193._16_4_ = fVar84 * local_400;
      auVar193._20_4_ = fVar85 * local_400;
      auVar193._24_4_ = fVar86 * local_400;
      auVar193._28_4_ = local_400;
      auVar15 = vfmadd231ps_fma(auVar193,auVar200,local_5a0);
      uStack_3d8 = local_3e0;
      uStack_3d0 = local_3e0;
      uStack_3c8 = local_3e0;
      auVar116._4_4_ = fVar219 * fVar81;
      auVar116._0_4_ = fVar212 * fVar80;
      auVar116._8_4_ = fVar212 * fVar82;
      auVar116._12_4_ = fVar219 * fVar83;
      auVar116._16_4_ = fVar212 * fVar84;
      auVar116._20_4_ = fVar219 * fVar85;
      auVar116._24_4_ = fVar212 * fVar86;
      auVar116._28_4_ = uVar204;
      auVar126 = vfmadd231ps_fma(auVar116,auVar200,local_540);
      auVar193 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar209 = ZEXT3264(auVar193);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar193,local_560);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar193,local_440);
      auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,auVar203);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar116,local_420);
      local_2c0 = ZEXT1632(auVar15);
      local_2a0 = ZEXT1632(auVar14);
      auVar229 = vsubps_avx(local_2c0,local_2a0);
      local_2e0 = ZEXT1632(auVar126);
      local_300 = ZEXT1632(auVar13);
      local_320 = vsubps_avx(local_2e0,local_300);
      auVar109._0_4_ = auVar13._0_4_ * auVar229._0_4_;
      auVar109._4_4_ = auVar13._4_4_ * auVar229._4_4_;
      auVar109._8_4_ = auVar13._8_4_ * auVar229._8_4_;
      auVar109._12_4_ = auVar13._12_4_ * auVar229._12_4_;
      auVar109._16_4_ = auVar229._16_4_ * 0.0;
      auVar109._20_4_ = auVar229._20_4_ * 0.0;
      auVar109._24_4_ = auVar229._24_4_ * 0.0;
      auVar109._28_4_ = 0;
      fVar213 = local_320._0_4_;
      auVar128._0_4_ = fVar213 * auVar14._0_4_;
      fVar220 = local_320._4_4_;
      auVar128._4_4_ = fVar220 * auVar14._4_4_;
      fVar221 = local_320._8_4_;
      auVar128._8_4_ = fVar221 * auVar14._8_4_;
      fVar223 = local_320._12_4_;
      auVar128._12_4_ = fVar223 * auVar14._12_4_;
      fVar224 = local_320._16_4_;
      auVar128._16_4_ = fVar224 * 0.0;
      fVar226 = local_320._20_4_;
      auVar128._20_4_ = fVar226 * 0.0;
      fVar227 = local_320._24_4_;
      auVar128._24_4_ = fVar227 * 0.0;
      auVar128._28_4_ = 0;
      auVar109 = vsubps_avx(auVar109,auVar128);
      auVar13 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar103 = auVar13._0_8_;
      local_80._8_8_ = uVar103;
      local_80._0_8_ = uVar103;
      local_80._16_8_ = uVar103;
      local_80._24_8_ = uVar103;
      auVar14 = vpermilps_avx(local_6b0,0xff);
      uVar103 = auVar14._0_8_;
      local_a0._8_8_ = uVar103;
      local_a0._0_8_ = uVar103;
      local_a0._16_8_ = uVar103;
      local_a0._24_8_ = uVar103;
      auVar14 = vpermilps_avx(local_6c0,0xff);
      uVar103 = auVar14._0_8_;
      local_c0._8_8_ = uVar103;
      local_c0._0_8_ = uVar103;
      local_c0._16_8_ = uVar103;
      local_c0._24_8_ = uVar103;
      auVar14 = vpermilps_avx(_local_6d0,0xff);
      local_e0 = auVar14._0_8_;
      fVar141 = auVar14._0_4_;
      fVar140 = auVar14._4_4_;
      auVar11._4_4_ = fVar120 * fVar140;
      auVar11._0_4_ = fVar119 * fVar141;
      auVar11._8_4_ = fVar121 * fVar141;
      auVar11._12_4_ = fVar122 * fVar140;
      auVar11._16_4_ = fVar123 * fVar141;
      auVar11._20_4_ = fVar124 * fVar140;
      auVar11._24_4_ = fVar214 * fVar141;
      auVar11._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar11,local_c0,auVar182);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar115,local_a0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar132,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar20._4_4_ = fVar81 * fVar140;
      auVar20._0_4_ = fVar80 * fVar141;
      auVar20._8_4_ = fVar82 * fVar141;
      auVar20._12_4_ = fVar83 * fVar140;
      auVar20._16_4_ = fVar84 * fVar141;
      auVar20._20_4_ = fVar85 * fVar140;
      auVar20._24_4_ = fVar86 * fVar141;
      auVar20._28_4_ = fVar140;
      auVar14 = vfmadd231ps_fma(auVar20,auVar200,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar193,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,local_80);
      auVar19._4_4_ = fVar220 * fVar220;
      auVar19._0_4_ = fVar213 * fVar213;
      auVar19._8_4_ = fVar221 * fVar221;
      auVar19._12_4_ = fVar223 * fVar223;
      auVar19._16_4_ = fVar224 * fVar224;
      auVar19._20_4_ = fVar226 * fVar226;
      auVar19._24_4_ = fVar227 * fVar227;
      auVar19._28_4_ = auVar13._4_4_;
      auVar13 = vfmadd231ps_fma(auVar19,auVar229,auVar229);
      local_700._0_32_ = ZEXT1632(auVar12);
      auVar11 = vmaxps_avx(local_700._0_32_,ZEXT1632(auVar14));
      auVar17._4_4_ = auVar11._4_4_ * auVar11._4_4_ * auVar13._4_4_;
      auVar17._0_4_ = auVar11._0_4_ * auVar11._0_4_ * auVar13._0_4_;
      auVar17._8_4_ = auVar11._8_4_ * auVar11._8_4_ * auVar13._8_4_;
      auVar17._12_4_ = auVar11._12_4_ * auVar11._12_4_ * auVar13._12_4_;
      auVar17._16_4_ = auVar11._16_4_ * auVar11._16_4_ * 0.0;
      auVar17._20_4_ = auVar11._20_4_ * auVar11._20_4_ * 0.0;
      auVar17._24_4_ = auVar11._24_4_ * auVar11._24_4_ * 0.0;
      auVar17._28_4_ = auVar11._28_4_;
      auVar18._4_4_ = auVar109._4_4_ * auVar109._4_4_;
      auVar18._0_4_ = auVar109._0_4_ * auVar109._0_4_;
      auVar18._8_4_ = auVar109._8_4_ * auVar109._8_4_;
      auVar18._12_4_ = auVar109._12_4_ * auVar109._12_4_;
      auVar18._16_4_ = auVar109._16_4_ * auVar109._16_4_;
      auVar18._20_4_ = auVar109._20_4_ * auVar109._20_4_;
      auVar18._24_4_ = auVar109._24_4_ * auVar109._24_4_;
      auVar18._28_4_ = auVar109._28_4_;
      auVar11 = vcmpps_avx(auVar18,auVar17,2);
      auVar110._0_4_ = (float)local_1fc;
      fVar141 = auVar165._0_4_ * 4.7683716e-07;
      local_460 = (ulong)(uint)auVar110._0_4_;
      uStack_458 = 0;
      auVar110._4_4_ = auVar110._0_4_;
      auVar110._8_4_ = auVar110._0_4_;
      auVar110._12_4_ = auVar110._0_4_;
      auVar110._16_4_ = auVar110._0_4_;
      auVar110._20_4_ = auVar110._0_4_;
      auVar110._24_4_ = auVar110._0_4_;
      auVar110._28_4_ = auVar110._0_4_;
      auVar109 = vcmpps_avx(_DAT_01faff40,auVar110,1);
      auVar165 = vpermilps_avx(auVar16,0xaa);
      uVar103 = auVar165._0_8_;
      auVar157._8_8_ = uVar103;
      auVar157._0_8_ = uVar103;
      auVar157._16_8_ = uVar103;
      auVar157._24_8_ = uVar103;
      auVar165 = vpermilps_avx(auVar107,0xaa);
      uVar103 = auVar165._0_8_;
      auVar210._8_8_ = uVar103;
      auVar210._0_8_ = uVar103;
      auVar210._16_8_ = uVar103;
      auVar210._24_8_ = uVar103;
      auVar165 = vpermilps_avx(auVar106,0xaa);
      uVar103 = auVar165._0_8_;
      auVar189._8_8_ = uVar103;
      auVar189._0_8_ = uVar103;
      auVar189._16_8_ = uVar103;
      auVar189._24_8_ = uVar103;
      auVar165 = vpermilps_avx(auVar142,0xaa);
      uVar103 = auVar165._0_8_;
      auVar20 = auVar109 & auVar11;
      uVar222 = uVar103;
      uVar225 = uVar103;
      uVar228 = uVar103;
      local_720._0_4_ = local_1fc;
      if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar20 >> 0x7f,0) == '\0') &&
            (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0xbf,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f])
      {
        auVar139 = ZEXT3264(local_5a0);
        auVar160 = ZEXT3264(local_540);
        auVar230 = ZEXT3264(local_560);
      }
      else {
        _local_340 = vandps_avx(auVar11,auVar109);
        fVar214 = auVar165._0_4_;
        fVar213 = auVar165._4_4_;
        auVar23._4_4_ = fVar213 * fVar81;
        auVar23._0_4_ = fVar214 * fVar80;
        auVar23._8_4_ = fVar214 * fVar82;
        auVar23._12_4_ = fVar213 * fVar83;
        auVar23._16_4_ = fVar214 * fVar84;
        auVar23._20_4_ = fVar213 * fVar85;
        auVar23._24_4_ = fVar214 * fVar86;
        auVar23._28_4_ = local_340._28_4_;
        auVar165 = vfmadd213ps_fma(auVar200,auVar189,auVar23);
        auVar165 = vfmadd213ps_fma(auVar193,auVar210,ZEXT1632(auVar165));
        auVar165 = vfmadd213ps_fma(auVar116,auVar157,ZEXT1632(auVar165));
        local_4a0._0_4_ = auVar91._0_4_;
        local_4a0._4_4_ = auVar91._4_4_;
        fStack_498 = auVar91._8_4_;
        fStack_494 = auVar91._12_4_;
        fStack_490 = auVar91._16_4_;
        fStack_48c = auVar91._20_4_;
        fStack_488 = auVar91._24_4_;
        auVar111._0_4_ = fVar214 * (float)local_4a0._0_4_;
        auVar111._4_4_ = fVar213 * (float)local_4a0._4_4_;
        auVar111._8_4_ = fVar214 * fStack_498;
        auVar111._12_4_ = fVar213 * fStack_494;
        auVar111._16_4_ = fVar214 * fStack_490;
        auVar111._20_4_ = fVar213 * fStack_48c;
        auVar111._24_4_ = fVar214 * fStack_488;
        auVar111._28_4_ = 0;
        auVar12 = vfmadd213ps_fma(auVar182,auVar189,auVar111);
        auVar12 = vfmadd213ps_fma(auVar115,auVar210,ZEXT1632(auVar12));
        auVar182 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar200 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        local_660 = auVar157;
        fVar140 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar119 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar120 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar121 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar122 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar123 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar124 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        local_640 = auVar203;
        auVar24._4_4_ = local_400 * fVar119;
        auVar24._0_4_ = local_400 * fVar140;
        auVar24._8_4_ = local_400 * fVar120;
        auVar24._12_4_ = local_400 * fVar121;
        auVar24._16_4_ = local_400 * fVar122;
        auVar24._20_4_ = local_400 * fVar123;
        auVar24._24_4_ = local_400 * fVar124;
        auVar24._28_4_ = auVar203._0_4_;
        auVar25._4_4_ = fVar219 * fVar119;
        auVar25._0_4_ = fVar212 * fVar140;
        auVar25._8_4_ = fVar212 * fVar120;
        auVar25._12_4_ = fVar219 * fVar121;
        auVar25._16_4_ = fVar212 * fVar122;
        auVar25._20_4_ = fVar219 * fVar123;
        auVar25._24_4_ = fVar212 * fVar124;
        auVar25._28_4_ = fVar213;
        _local_4a0 = auVar229;
        auVar26._4_4_ = fVar119 * fVar213;
        auVar26._0_4_ = fVar140 * fVar214;
        auVar26._8_4_ = fVar120 * fVar214;
        auVar26._12_4_ = fVar121 * fVar213;
        auVar26._16_4_ = fVar122 * fVar214;
        auVar26._20_4_ = fVar123 * fVar213;
        auVar26._24_4_ = fVar124 * fVar214;
        auVar26._28_4_ = auVar229._28_4_;
        auVar13 = vfmadd231ps_fma(auVar24,auVar200,local_5a0);
        auVar15 = vfmadd231ps_fma(auVar25,auVar200,local_540);
        auVar16 = vfmadd231ps_fma(auVar26,auVar189,auVar200);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar115,local_560);
        local_760._16_16_ = auVar184._16_16_;
        local_760._0_16_ = ZEXT416((uint)fVar141);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar115,local_440);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar210,auVar115);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar182,auVar203);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar182,local_420);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar182,auVar157);
        fVar140 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar119 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar120 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar121 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar122 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar123 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar124 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar182._4_4_ = local_400 * fVar119;
        auVar182._0_4_ = local_400 * fVar140;
        auVar182._8_4_ = local_400 * fVar120;
        auVar182._12_4_ = local_400 * fVar121;
        auVar182._16_4_ = local_400 * fVar122;
        auVar182._20_4_ = local_400 * fVar123;
        auVar182._24_4_ = local_400 * fVar124;
        auVar182._28_4_ = local_400;
        auVar200._4_4_ = fVar219 * fVar119;
        auVar200._0_4_ = fVar212 * fVar140;
        auVar200._8_4_ = fVar212 * fVar120;
        auVar200._12_4_ = fVar219 * fVar121;
        auVar200._16_4_ = fVar212 * fVar122;
        auVar200._20_4_ = fVar219 * fVar123;
        auVar200._24_4_ = fVar212 * fVar124;
        auVar200._28_4_ = fVar219;
        local_5e0 = uVar103;
        uStack_5d8 = uVar103;
        uStack_5d0 = uVar103;
        uStack_5c8 = uVar103;
        auVar27._4_4_ = fVar213 * fVar119;
        auVar27._0_4_ = fVar214 * fVar140;
        auVar27._8_4_ = fVar214 * fVar120;
        auVar27._12_4_ = fVar213 * fVar121;
        auVar27._16_4_ = fVar214 * fVar122;
        auVar27._20_4_ = fVar213 * fVar123;
        auVar27._24_4_ = fVar214 * fVar124;
        auVar27._28_4_ = fVar213;
        auVar184 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar107 = vfmadd231ps_fma(auVar182,auVar184,local_5a0);
        auVar106 = vfmadd231ps_fma(auVar200,auVar184,local_540);
        local_5c0 = auVar189;
        auVar142 = vfmadd231ps_fma(auVar27,auVar189,auVar184);
        auVar184 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar184,local_560);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar184,local_440);
        local_580 = auVar210;
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar210,auVar184);
        auVar184 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar184,auVar203);
        auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar184,local_420);
        auVar129._8_4_ = 0x7fffffff;
        auVar129._0_8_ = 0x7fffffff7fffffff;
        auVar129._12_4_ = 0x7fffffff;
        auVar129._16_4_ = 0x7fffffff;
        auVar129._20_4_ = 0x7fffffff;
        auVar129._24_4_ = 0x7fffffff;
        auVar129._28_4_ = 0x7fffffff;
        auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar157,auVar184);
        auVar184 = vandps_avx(ZEXT1632(auVar13),auVar129);
        auVar182 = vandps_avx(ZEXT1632(auVar15),auVar129);
        auVar182 = vmaxps_avx(auVar184,auVar182);
        auVar184 = vandps_avx(ZEXT1632(auVar16),auVar129);
        auVar184 = vmaxps_avx(auVar182,auVar184);
        auVar152._4_4_ = fVar141;
        auVar152._0_4_ = fVar141;
        auVar152._8_4_ = fVar141;
        auVar152._12_4_ = fVar141;
        auVar152._16_4_ = fVar141;
        auVar152._20_4_ = fVar141;
        auVar152._24_4_ = fVar141;
        auVar152._28_4_ = fVar141;
        auVar184 = vcmpps_avx(auVar184,auVar152,1);
        auVar115 = vblendvps_avx(ZEXT1632(auVar13),auVar229,auVar184);
        auVar200 = vblendvps_avx(ZEXT1632(auVar15),local_320,auVar184);
        auVar184 = vandps_avx(ZEXT1632(auVar107),auVar129);
        auVar182 = vandps_avx(ZEXT1632(auVar106),auVar129);
        auVar193 = vmaxps_avx(auVar184,auVar182);
        auVar184 = vandps_avx(ZEXT1632(auVar142),auVar129);
        auVar184 = vmaxps_avx(auVar193,auVar184);
        auVar116 = vcmpps_avx(auVar184,auVar152,1);
        auVar184 = vblendvps_avx(ZEXT1632(auVar107),auVar229,auVar116);
        auVar193 = vblendvps_avx(ZEXT1632(auVar106),local_320,auVar116);
        auVar12 = vfmadd213ps_fma(auVar132,auVar157,ZEXT1632(auVar12));
        auVar13 = vfmadd213ps_fma(auVar115,auVar115,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar200,auVar200);
        auVar132 = vrsqrtps_avx(ZEXT1632(auVar13));
        fVar140 = auVar132._0_4_;
        fVar119 = auVar132._4_4_;
        fVar120 = auVar132._8_4_;
        fVar121 = auVar132._12_4_;
        fVar122 = auVar132._16_4_;
        fVar123 = auVar132._20_4_;
        fVar124 = auVar132._24_4_;
        auVar229._4_4_ = fVar119 * fVar119 * fVar119 * auVar13._4_4_ * -0.5;
        auVar229._0_4_ = fVar140 * fVar140 * fVar140 * auVar13._0_4_ * -0.5;
        auVar229._8_4_ = fVar120 * fVar120 * fVar120 * auVar13._8_4_ * -0.5;
        auVar229._12_4_ = fVar121 * fVar121 * fVar121 * auVar13._12_4_ * -0.5;
        auVar229._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar229._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar229._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar229._28_4_ = 0;
        auVar217._8_4_ = 0x3fc00000;
        auVar217._0_8_ = 0x3fc000003fc00000;
        auVar217._12_4_ = 0x3fc00000;
        auVar217._16_4_ = 0x3fc00000;
        auVar217._20_4_ = 0x3fc00000;
        auVar217._24_4_ = 0x3fc00000;
        auVar217._28_4_ = 0x3fc00000;
        auVar13 = vfmadd231ps_fma(auVar229,auVar217,auVar132);
        fVar140 = auVar13._0_4_;
        fVar119 = auVar13._4_4_;
        auVar28._4_4_ = auVar200._4_4_ * fVar119;
        auVar28._0_4_ = auVar200._0_4_ * fVar140;
        fVar120 = auVar13._8_4_;
        auVar28._8_4_ = auVar200._8_4_ * fVar120;
        fVar121 = auVar13._12_4_;
        auVar28._12_4_ = auVar200._12_4_ * fVar121;
        auVar28._16_4_ = auVar200._16_4_ * 0.0;
        auVar28._20_4_ = auVar200._20_4_ * 0.0;
        auVar28._24_4_ = auVar200._24_4_ * 0.0;
        auVar28._28_4_ = auVar132._28_4_;
        auVar29._4_4_ = fVar119 * -auVar115._4_4_;
        auVar29._0_4_ = fVar140 * -auVar115._0_4_;
        auVar29._8_4_ = fVar120 * -auVar115._8_4_;
        auVar29._12_4_ = fVar121 * -auVar115._12_4_;
        auVar29._16_4_ = -auVar115._16_4_ * 0.0;
        auVar29._20_4_ = -auVar115._20_4_ * 0.0;
        auVar29._24_4_ = -auVar115._24_4_ * 0.0;
        auVar29._28_4_ = auVar182._28_4_;
        auVar13 = vfmadd213ps_fma(auVar184,auVar184,ZEXT832(0) << 0x20);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar193,auVar193);
        auVar182 = vrsqrtps_avx(ZEXT1632(auVar13));
        auVar30._28_4_ = auVar116._28_4_;
        auVar30._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * 0.0,
                                CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar140 * 0.0))));
        fVar140 = auVar182._0_4_;
        fVar119 = auVar182._4_4_;
        fVar120 = auVar182._8_4_;
        fVar121 = auVar182._12_4_;
        fVar122 = auVar182._16_4_;
        fVar123 = auVar182._20_4_;
        fVar124 = auVar182._24_4_;
        auVar31._4_4_ = fVar119 * fVar119 * fVar119 * auVar13._4_4_ * -0.5;
        auVar31._0_4_ = fVar140 * fVar140 * fVar140 * auVar13._0_4_ * -0.5;
        auVar31._8_4_ = fVar120 * fVar120 * fVar120 * auVar13._8_4_ * -0.5;
        auVar31._12_4_ = fVar121 * fVar121 * fVar121 * auVar13._12_4_ * -0.5;
        auVar31._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar31._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar31._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar31._28_4_ = 0;
        auVar13 = vfmadd231ps_fma(auVar31,auVar217,auVar182);
        fVar140 = auVar13._0_4_;
        fVar119 = auVar13._4_4_;
        auVar32._4_4_ = auVar193._4_4_ * fVar119;
        auVar32._0_4_ = auVar193._0_4_ * fVar140;
        fVar120 = auVar13._8_4_;
        auVar32._8_4_ = auVar193._8_4_ * fVar120;
        fVar121 = auVar13._12_4_;
        auVar32._12_4_ = auVar193._12_4_ * fVar121;
        auVar32._16_4_ = auVar193._16_4_ * 0.0;
        auVar32._20_4_ = auVar193._20_4_ * 0.0;
        auVar32._24_4_ = auVar193._24_4_ * 0.0;
        auVar32._28_4_ = 0;
        auVar33._4_4_ = -auVar184._4_4_ * fVar119;
        auVar33._0_4_ = -auVar184._0_4_ * fVar140;
        auVar33._8_4_ = -auVar184._8_4_ * fVar120;
        auVar33._12_4_ = -auVar184._12_4_ * fVar121;
        auVar33._16_4_ = -auVar184._16_4_ * 0.0;
        auVar33._20_4_ = -auVar184._20_4_ * 0.0;
        auVar33._24_4_ = -auVar184._24_4_ * 0.0;
        auVar33._28_4_ = auVar193._28_4_;
        auVar184._28_4_ = auVar182._28_4_;
        auVar184._0_28_ =
             ZEXT1628(CONCAT412(fVar121 * 0.0,
                                CONCAT48(fVar120 * 0.0,CONCAT44(fVar119 * 0.0,fVar140 * 0.0))));
        auVar13 = vfmadd213ps_fma(auVar28,local_700._0_32_,local_2a0);
        local_720 = ZEXT1632(auVar13);
        auVar15 = vfmadd213ps_fma(auVar29,local_700._0_32_,local_300);
        auVar16 = vfmadd213ps_fma(auVar30,local_700._0_32_,ZEXT1632(auVar12));
        auVar142 = vfnmadd213ps_fma(auVar28,local_700._0_32_,local_2a0);
        auVar107 = vfmadd213ps_fma(auVar32,ZEXT1632(auVar14),local_2c0);
        auVar126 = vfnmadd213ps_fma(auVar29,local_700._0_32_,local_300);
        auVar182 = ZEXT1632(auVar14);
        auVar106 = vfmadd213ps_fma(auVar33,auVar182,local_2e0);
        auVar125 = vfnmadd231ps_fma(ZEXT1632(auVar12),local_700._0_32_,auVar30);
        auVar12 = vfmadd213ps_fma(auVar184,auVar182,ZEXT1632(auVar165));
        auVar162 = vfnmadd213ps_fma(auVar32,auVar182,local_2c0);
        auVar104 = vfnmadd213ps_fma(auVar33,auVar182,local_2e0);
        local_480 = ZEXT1632(auVar14);
        auVar161 = vfnmadd231ps_fma(ZEXT1632(auVar165),local_480,auVar184);
        auVar184 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar126));
        auVar182 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar125));
        auVar34._4_4_ = auVar125._4_4_ * auVar184._4_4_;
        auVar34._0_4_ = auVar125._0_4_ * auVar184._0_4_;
        auVar34._8_4_ = auVar125._8_4_ * auVar184._8_4_;
        auVar34._12_4_ = auVar125._12_4_ * auVar184._12_4_;
        auVar34._16_4_ = auVar184._16_4_ * 0.0;
        auVar34._20_4_ = auVar184._20_4_ * 0.0;
        auVar34._24_4_ = auVar184._24_4_ * 0.0;
        auVar34._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar34,ZEXT1632(auVar126),auVar182);
        auVar35._4_4_ = auVar142._4_4_ * auVar182._4_4_;
        auVar35._0_4_ = auVar142._0_4_ * auVar182._0_4_;
        auVar35._8_4_ = auVar142._8_4_ * auVar182._8_4_;
        auVar35._12_4_ = auVar142._12_4_ * auVar182._12_4_;
        auVar35._16_4_ = auVar182._16_4_ * 0.0;
        auVar35._20_4_ = auVar182._20_4_ * 0.0;
        auVar35._24_4_ = auVar182._24_4_ * 0.0;
        auVar35._28_4_ = auVar182._28_4_;
        auVar193 = ZEXT1632(auVar142);
        auVar182 = vsubps_avx(ZEXT1632(auVar107),auVar193);
        auVar165 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar125),auVar182);
        auVar36._4_4_ = auVar126._4_4_ * auVar182._4_4_;
        auVar36._0_4_ = auVar126._0_4_ * auVar182._0_4_;
        auVar36._8_4_ = auVar126._8_4_ * auVar182._8_4_;
        auVar36._12_4_ = auVar126._12_4_ * auVar182._12_4_;
        auVar36._16_4_ = auVar182._16_4_ * 0.0;
        auVar36._20_4_ = auVar182._20_4_ * 0.0;
        auVar36._24_4_ = auVar182._24_4_ * 0.0;
        auVar36._28_4_ = auVar182._28_4_;
        auVar142 = vfmsub231ps_fma(auVar36,auVar193,auVar184);
        auVar184 = ZEXT1232(ZEXT412(0)) << 0x20;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar142),auVar184,ZEXT1632(auVar165));
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar184,ZEXT1632(auVar14));
        auVar109 = vcmpps_avx(ZEXT1632(auVar165),ZEXT1232(ZEXT412(0)) << 0x20,2);
        local_780 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar13),auVar109);
        auVar184 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar15),auVar109);
        auVar182 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar16),auVar109);
        auVar115 = vblendvps_avx(auVar193,ZEXT1632(auVar107),auVar109);
        auVar132 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar106),auVar109);
        auVar200 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar12),auVar109);
        auVar193 = vblendvps_avx(ZEXT1632(auVar107),auVar193,auVar109);
        auVar116 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar126),auVar109);
        auVar165 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
        auVar11 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar125),auVar109);
        auVar229 = vsubps_avx(auVar193,local_780);
        auVar116 = vsubps_avx(auVar116,auVar184);
        auVar20 = vsubps_avx(auVar11,auVar182);
        auVar19 = vsubps_avx(local_780,auVar115);
        auVar17 = vsubps_avx(auVar184,auVar132);
        auVar18 = vsubps_avx(auVar182,auVar200);
        auVar37._4_4_ = auVar20._4_4_ * local_780._4_4_;
        auVar37._0_4_ = auVar20._0_4_ * local_780._0_4_;
        auVar37._8_4_ = auVar20._8_4_ * local_780._8_4_;
        auVar37._12_4_ = auVar20._12_4_ * local_780._12_4_;
        auVar37._16_4_ = auVar20._16_4_ * local_780._16_4_;
        auVar37._20_4_ = auVar20._20_4_ * local_780._20_4_;
        auVar37._24_4_ = auVar20._24_4_ * local_780._24_4_;
        auVar37._28_4_ = auVar11._28_4_;
        auVar12 = vfmsub231ps_fma(auVar37,auVar182,auVar229);
        auVar38._4_4_ = auVar229._4_4_ * auVar184._4_4_;
        auVar38._0_4_ = auVar229._0_4_ * auVar184._0_4_;
        auVar38._8_4_ = auVar229._8_4_ * auVar184._8_4_;
        auVar38._12_4_ = auVar229._12_4_ * auVar184._12_4_;
        auVar38._16_4_ = auVar229._16_4_ * auVar184._16_4_;
        auVar38._20_4_ = auVar229._20_4_ * auVar184._20_4_;
        auVar38._24_4_ = auVar229._24_4_ * auVar184._24_4_;
        auVar38._28_4_ = auVar193._28_4_;
        auVar14 = vfmsub231ps_fma(auVar38,local_780,auVar116);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar112._0_4_ = auVar116._0_4_ * auVar182._0_4_;
        auVar112._4_4_ = auVar116._4_4_ * auVar182._4_4_;
        auVar112._8_4_ = auVar116._8_4_ * auVar182._8_4_;
        auVar112._12_4_ = auVar116._12_4_ * auVar182._12_4_;
        auVar112._16_4_ = auVar116._16_4_ * auVar182._16_4_;
        auVar112._20_4_ = auVar116._20_4_ * auVar182._20_4_;
        auVar112._24_4_ = auVar116._24_4_ * auVar182._24_4_;
        auVar112._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar112,auVar184,auVar20);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar113._0_4_ = auVar18._0_4_ * auVar115._0_4_;
        auVar113._4_4_ = auVar18._4_4_ * auVar115._4_4_;
        auVar113._8_4_ = auVar18._8_4_ * auVar115._8_4_;
        auVar113._12_4_ = auVar18._12_4_ * auVar115._12_4_;
        auVar113._16_4_ = auVar18._16_4_ * auVar115._16_4_;
        auVar113._20_4_ = auVar18._20_4_ * auVar115._20_4_;
        auVar113._24_4_ = auVar18._24_4_ * auVar115._24_4_;
        auVar113._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar113,auVar19,auVar200);
        auVar39._4_4_ = auVar17._4_4_ * auVar200._4_4_;
        auVar39._0_4_ = auVar17._0_4_ * auVar200._0_4_;
        auVar39._8_4_ = auVar17._8_4_ * auVar200._8_4_;
        auVar39._12_4_ = auVar17._12_4_ * auVar200._12_4_;
        auVar39._16_4_ = auVar17._16_4_ * auVar200._16_4_;
        auVar39._20_4_ = auVar17._20_4_ * auVar200._20_4_;
        auVar39._24_4_ = auVar17._24_4_ * auVar200._24_4_;
        auVar39._28_4_ = auVar200._28_4_;
        auVar15 = vfmsub231ps_fma(auVar39,auVar132,auVar18);
        auVar40._4_4_ = auVar19._4_4_ * auVar132._4_4_;
        auVar40._0_4_ = auVar19._0_4_ * auVar132._0_4_;
        auVar40._8_4_ = auVar19._8_4_ * auVar132._8_4_;
        auVar40._12_4_ = auVar19._12_4_ * auVar132._12_4_;
        auVar40._16_4_ = auVar19._16_4_ * auVar132._16_4_;
        auVar40._20_4_ = auVar19._20_4_ * auVar132._20_4_;
        auVar40._24_4_ = auVar19._24_4_ * auVar132._24_4_;
        auVar40._28_4_ = auVar132._28_4_;
        auVar16 = vfmsub231ps_fma(auVar40,auVar17,auVar115);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
        auVar115 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
        auVar115 = vcmpps_avx(auVar115,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar115._0_16_,auVar115._16_16_);
        auVar165 = vpand_avx(auVar165,auVar12);
        auVar115 = vpmovsxwd_avx2(auVar165);
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) {
LAB_015c143d:
          auVar173._8_8_ = local_520[1]._8_8_;
          auVar173._0_8_ = local_520[1]._0_8_;
          auVar173._16_8_ = local_520[1]._16_8_;
          auVar173._24_8_ = local_520[1]._24_8_;
        }
        else {
          auVar41._4_4_ = auVar116._4_4_ * auVar18._4_4_;
          auVar41._0_4_ = auVar116._0_4_ * auVar18._0_4_;
          auVar41._8_4_ = auVar116._8_4_ * auVar18._8_4_;
          auVar41._12_4_ = auVar116._12_4_ * auVar18._12_4_;
          auVar41._16_4_ = auVar116._16_4_ * auVar18._16_4_;
          auVar41._20_4_ = auVar116._20_4_ * auVar18._20_4_;
          auVar41._24_4_ = auVar116._24_4_ * auVar18._24_4_;
          auVar41._28_4_ = auVar115._28_4_;
          auVar106 = vfmsub231ps_fma(auVar41,auVar17,auVar20);
          auVar130._0_4_ = auVar19._0_4_ * auVar20._0_4_;
          auVar130._4_4_ = auVar19._4_4_ * auVar20._4_4_;
          auVar130._8_4_ = auVar19._8_4_ * auVar20._8_4_;
          auVar130._12_4_ = auVar19._12_4_ * auVar20._12_4_;
          auVar130._16_4_ = auVar19._16_4_ * auVar20._16_4_;
          auVar130._20_4_ = auVar19._20_4_ * auVar20._20_4_;
          auVar130._24_4_ = auVar19._24_4_ * auVar20._24_4_;
          auVar130._28_4_ = 0;
          auVar107 = vfmsub231ps_fma(auVar130,auVar229,auVar18);
          auVar42._4_4_ = auVar229._4_4_ * auVar17._4_4_;
          auVar42._0_4_ = auVar229._0_4_ * auVar17._0_4_;
          auVar42._8_4_ = auVar229._8_4_ * auVar17._8_4_;
          auVar42._12_4_ = auVar229._12_4_ * auVar17._12_4_;
          auVar42._16_4_ = auVar229._16_4_ * auVar17._16_4_;
          auVar42._20_4_ = auVar229._20_4_ * auVar17._20_4_;
          auVar42._24_4_ = auVar229._24_4_ * auVar17._24_4_;
          auVar42._28_4_ = auVar229._28_4_;
          auVar142 = vfmsub231ps_fma(auVar42,auVar19,auVar116);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar142));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar106),_DAT_01faff00);
          auVar115 = vrcpps_avx(ZEXT1632(auVar16));
          auVar207._8_4_ = 0x3f800000;
          auVar207._0_8_ = 0x3f8000003f800000;
          auVar207._12_4_ = 0x3f800000;
          auVar207._16_4_ = 0x3f800000;
          auVar207._20_4_ = 0x3f800000;
          auVar207._24_4_ = 0x3f800000;
          auVar207._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar115,ZEXT1632(auVar16),auVar207);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar115,auVar115);
          auVar43._4_4_ = auVar142._4_4_ * auVar182._4_4_;
          auVar43._0_4_ = auVar142._0_4_ * auVar182._0_4_;
          auVar43._8_4_ = auVar142._8_4_ * auVar182._8_4_;
          auVar43._12_4_ = auVar142._12_4_ * auVar182._12_4_;
          auVar43._16_4_ = auVar182._16_4_ * 0.0;
          auVar43._20_4_ = auVar182._20_4_ * 0.0;
          auVar43._24_4_ = auVar182._24_4_ * 0.0;
          auVar43._28_4_ = auVar182._28_4_;
          auVar107 = vfmadd231ps_fma(auVar43,auVar184,ZEXT1632(auVar107));
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar106),local_780);
          fVar119 = auVar12._0_4_;
          fVar120 = auVar12._4_4_;
          fVar121 = auVar12._8_4_;
          fVar122 = auVar12._12_4_;
          auVar44._28_4_ = auVar184._28_4_;
          auVar44._0_28_ =
               ZEXT1628(CONCAT412(fVar122 * auVar107._12_4_,
                                  CONCAT48(fVar121 * auVar107._8_4_,
                                           CONCAT44(fVar120 * auVar107._4_4_,
                                                    fVar119 * auVar107._0_4_))));
          auVar12 = vpermilps_avx((undefined1  [16])aVar5,0xff);
          auVar114._0_8_ = auVar12._0_8_;
          auVar114._8_8_ = auVar114._0_8_;
          auVar114._16_8_ = auVar114._0_8_;
          auVar114._24_8_ = auVar114._0_8_;
          fVar140 = (ray->super_RayK<1>).tfar;
          auVar131._4_4_ = fVar140;
          auVar131._0_4_ = fVar140;
          auVar131._8_4_ = fVar140;
          auVar131._12_4_ = fVar140;
          auVar131._16_4_ = fVar140;
          auVar131._20_4_ = fVar140;
          auVar131._24_4_ = fVar140;
          auVar131._28_4_ = fVar140;
          auVar184 = vcmpps_avx(auVar114,auVar44,2);
          auVar182 = vcmpps_avx(auVar44,auVar131,2);
          auVar184 = vandps_avx(auVar182,auVar184);
          auVar12 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar165 = vpand_avx(auVar165,auVar12);
          auVar184 = vpmovsxwd_avx2(auVar165);
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0x7f,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar184 >> 0xbf,0) == '\0') &&
              (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar184[0x1f]) goto LAB_015c143d;
          auVar184 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
          auVar165 = vpand_avx(auVar165,auVar12);
          auVar184 = vpmovsxwd_avx2(auVar165);
          auVar173._8_8_ = local_520[1]._8_8_;
          auVar173._0_8_ = local_520[1]._0_8_;
          auVar173._16_8_ = local_520[1]._16_8_;
          auVar173._24_8_ = local_520[1]._24_8_;
          if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0x7f,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar184 >> 0xbf,0) != '\0') ||
              (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar184[0x1f] < '\0') {
            auVar115 = ZEXT1632(CONCAT412(fVar122 * auVar14._12_4_,
                                          CONCAT48(fVar121 * auVar14._8_4_,
                                                   CONCAT44(fVar120 * auVar14._4_4_,
                                                            fVar119 * auVar14._0_4_))));
            auVar132 = ZEXT1632(CONCAT412(fVar122 * auVar15._12_4_,
                                          CONCAT48(fVar121 * auVar15._8_4_,
                                                   CONCAT44(fVar120 * auVar15._4_4_,
                                                            fVar119 * auVar15._0_4_))));
            auVar172._8_4_ = 0x3f800000;
            auVar172._0_8_ = 0x3f8000003f800000;
            auVar172._12_4_ = 0x3f800000;
            auVar172._16_4_ = 0x3f800000;
            auVar172._20_4_ = 0x3f800000;
            auVar172._24_4_ = 0x3f800000;
            auVar172._28_4_ = 0x3f800000;
            auVar182 = vsubps_avx(auVar172,auVar115);
            _local_120 = vblendvps_avx(auVar182,auVar115,auVar109);
            auVar182 = vsubps_avx(auVar172,auVar132);
            local_380 = vblendvps_avx(auVar182,auVar132,auVar109);
            local_360 = auVar44;
            auVar173 = auVar184;
          }
        }
        auVar230 = ZEXT3264(local_560);
        auVar211 = ZEXT3264(auVar203);
        auVar209 = ZEXT3264(auVar189);
        auVar160 = ZEXT3264(auVar210);
        auVar139 = ZEXT3264(auVar157);
        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar173 >> 0x7f,0) == '\0') &&
              (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar173 >> 0xbf,0) == '\0') &&
            (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar173[0x1f]) {
          auVar139 = ZEXT3264(local_5a0);
          auVar160 = ZEXT3264(local_540);
        }
        else {
          auVar184 = vsubps_avx(local_480,local_700._0_32_);
          auVar165 = vfmadd213ps_fma(auVar184,_local_120,local_700._0_32_);
          fVar140 = pre->depth_scale;
          auVar45._4_4_ = (auVar165._4_4_ + auVar165._4_4_) * fVar140;
          auVar45._0_4_ = (auVar165._0_4_ + auVar165._0_4_) * fVar140;
          auVar45._8_4_ = (auVar165._8_4_ + auVar165._8_4_) * fVar140;
          auVar45._12_4_ = (auVar165._12_4_ + auVar165._12_4_) * fVar140;
          auVar45._16_4_ = fVar140 * 0.0;
          auVar45._20_4_ = fVar140 * 0.0;
          auVar45._24_4_ = fVar140 * 0.0;
          auVar45._28_4_ = 0;
          auVar184 = vcmpps_avx(local_360,auVar45,6);
          auVar182 = auVar173 & auVar184;
          auVar190 = ZEXT3264(auVar189);
          _local_6d0 = auVar105;
          local_6c0 = auVar127;
          local_6b0 = auVar155;
          if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar182 >> 0x7f,0) != '\0') ||
                (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar182 >> 0xbf,0) != '\0') ||
              (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar182[0x1f] < '\0') {
            auVar133._8_4_ = 0xbf800000;
            auVar133._0_8_ = 0xbf800000bf800000;
            auVar133._12_4_ = 0xbf800000;
            auVar133._16_4_ = 0xbf800000;
            auVar133._20_4_ = 0xbf800000;
            auVar133._24_4_ = 0xbf800000;
            auVar133._28_4_ = 0xbf800000;
            auVar153._8_4_ = 0x40000000;
            auVar153._0_8_ = 0x4000000040000000;
            auVar153._12_4_ = 0x40000000;
            auVar153._16_4_ = 0x40000000;
            auVar153._20_4_ = 0x40000000;
            auVar153._24_4_ = 0x40000000;
            auVar153._28_4_ = 0x40000000;
            auVar165 = vfmadd213ps_fma(local_380,auVar153,auVar133);
            local_260 = _local_120;
            local_380 = ZEXT1632(auVar165);
            auVar182 = local_380;
            local_240 = ZEXT1632(auVar165);
            local_220 = local_360;
            local_200 = 0;
            local_1f0 = *(undefined8 *)pPVar1;
            uStack_1e8 = *(undefined8 *)(pPVar1 + 8);
            local_1e0 = local_6b0._0_8_;
            uStack_1d8 = local_6b0._8_8_;
            local_1d0 = local_6c0._0_8_;
            uStack_1c8 = local_6c0._8_8_;
            local_1c0 = local_6d0;
            uStack_1b8 = uStack_6c8;
            local_380 = auVar182;
            if ((local_4e0->mask & (ray->super_RayK<1>).mask) != 0) {
              auVar184 = vandps_avx(auVar184,auVar173);
              local_520[0] = auVar184;
              fVar140 = 1.0 / auVar110._0_4_;
              local_180[0] = fVar140 * ((float)local_120._0_4_ + 0.0);
              local_180[1] = fVar140 * ((float)local_120._4_4_ + 1.0);
              local_180[2] = fVar140 * (fStack_118 + 2.0);
              local_180[3] = fVar140 * (fStack_114 + 3.0);
              fStack_170 = fVar140 * (fStack_110 + 4.0);
              fStack_16c = fVar140 * (fStack_10c + 5.0);
              fStack_168 = fVar140 * (fStack_108 + 6.0);
              fStack_164 = fStack_104 + 7.0;
              local_380._0_8_ = auVar165._0_8_;
              local_380._8_8_ = auVar165._8_8_;
              local_160 = local_380._0_8_;
              uStack_158 = local_380._8_8_;
              uStack_150 = 0;
              uStack_148 = 0;
              local_140 = local_360;
              auVar134._8_4_ = 0x7f800000;
              auVar134._0_8_ = 0x7f8000007f800000;
              auVar134._12_4_ = 0x7f800000;
              auVar134._16_4_ = 0x7f800000;
              auVar134._20_4_ = 0x7f800000;
              auVar134._24_4_ = 0x7f800000;
              auVar134._28_4_ = 0x7f800000;
              auVar182 = vblendvps_avx(auVar134,local_360,auVar184);
              auVar115 = vshufps_avx(auVar182,auVar182,0xb1);
              auVar115 = vminps_avx(auVar182,auVar115);
              auVar132 = vshufpd_avx(auVar115,auVar115,5);
              auVar115 = vminps_avx(auVar115,auVar132);
              auVar132 = vpermpd_avx2(auVar115,0x4e);
              auVar115 = vminps_avx(auVar115,auVar132);
              auVar182 = vcmpps_avx(auVar182,auVar115,0);
              auVar115 = auVar184 & auVar182;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0x7f,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar115 >> 0xbf,0) != '\0') ||
                  (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar115[0x1f] < '\0') {
                auVar184 = vandps_avx(auVar182,auVar184);
              }
              uVar92 = vmovmskps_avx(auVar184);
              uVar93 = 0;
              for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
                uVar93 = uVar93 + 1;
              }
              uVar94 = (ulong)uVar93;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (local_4e0->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                local_720 = ZEXT1632(CONCAT124(auVar13._4_12_,local_1fc));
                local_780 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                local_788 = uVar96;
                do {
                  local_604 = local_180[uVar94];
                  local_600 = *(undefined4 *)((long)&local_160 + uVar94 * 4);
                  (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar94 * 4);
                  local_690.context = context->user;
                  fVar140 = 1.0 - local_604;
                  auVar165 = ZEXT416((uint)(local_604 * fVar140 * 4.0));
                  auVar12 = vfnmsub213ss_fma(ZEXT416((uint)local_604),ZEXT416((uint)local_604),
                                             auVar165);
                  auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar165)
                  ;
                  fVar140 = fVar140 * -fVar140 * 0.5;
                  fVar119 = auVar12._0_4_ * 0.5;
                  fVar120 = auVar165._0_4_ * 0.5;
                  fVar121 = local_604 * local_604 * 0.5;
                  auVar170._0_4_ = fVar121 * (float)local_6d0._0_4_;
                  auVar170._4_4_ = fVar121 * (float)local_6d0._4_4_;
                  auVar170._8_4_ = fVar121 * (float)uStack_6c8;
                  auVar170._12_4_ = fVar121 * uStack_6c8._4_4_;
                  auVar150._4_4_ = fVar120;
                  auVar150._0_4_ = fVar120;
                  auVar150._8_4_ = fVar120;
                  auVar150._12_4_ = fVar120;
                  auVar165 = vfmadd132ps_fma(auVar150,auVar170,local_6c0);
                  auVar171._4_4_ = fVar119;
                  auVar171._0_4_ = fVar119;
                  auVar171._8_4_ = fVar119;
                  auVar171._12_4_ = fVar119;
                  auVar165 = vfmadd132ps_fma(auVar171,auVar165,local_6b0);
                  auVar151._4_4_ = fVar140;
                  auVar151._0_4_ = fVar140;
                  auVar151._8_4_ = fVar140;
                  auVar151._12_4_ = fVar140;
                  auVar89._8_8_ = uStack_728;
                  auVar89._0_8_ = local_730;
                  auVar165 = vfmadd132ps_fma(auVar151,auVar165,auVar89);
                  local_610 = vmovlps_avx(auVar165);
                  local_608 = vextractps_avx(auVar165,2);
                  local_5fc = uVar95;
                  local_5f8 = (int)uVar96;
                  local_5f4 = (local_690.context)->instID[0];
                  local_5f0 = (local_690.context)->instPrimID[0];
                  local_78c = -1;
                  local_690.valid = &local_78c;
                  local_690.geometryUserPtr = local_4e0->userPtr;
                  local_690.ray = (RTCRayN *)ray;
                  local_690.hit = (RTCHitN *)&local_610;
                  local_690.N = 1;
                  if (local_4e0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015c1691:
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((local_4e0->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar209 = ZEXT1664(auVar209._0_16_);
                      (*p_Var10)(&local_690);
                      auVar190 = ZEXT3264(local_5c0);
                      auVar160 = ZEXT3264(local_580);
                      auVar139 = ZEXT3264(local_660);
                      auVar211 = ZEXT3264(local_640);
                      auVar230 = ZEXT3264(local_560);
                      pre = local_6a0;
                      pPVar98 = local_698;
                      uVar96 = local_788;
                      fVar141 = (float)local_760._0_4_;
                      uVar103 = local_5e0;
                      uVar222 = uStack_5d8;
                      uVar225 = uStack_5d0;
                      uVar228 = uStack_5c8;
                      if (*local_690.valid == 0) goto LAB_015c17a2;
                    }
                    (((Vec3f *)((long)local_690.ray + 0x30))->field_0).components[0] =
                         *(float *)local_690.hit;
                    (((Vec3f *)((long)local_690.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_690.hit + 4);
                    (((Vec3f *)((long)local_690.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_690.hit + 8);
                    *(float *)((long)local_690.ray + 0x3c) = *(float *)(local_690.hit + 0xc);
                    *(float *)((long)local_690.ray + 0x40) = *(float *)(local_690.hit + 0x10);
                    *(float *)((long)local_690.ray + 0x44) = *(float *)(local_690.hit + 0x14);
                    *(float *)((long)local_690.ray + 0x48) = *(float *)(local_690.hit + 0x18);
                    *(float *)((long)local_690.ray + 0x4c) = *(float *)(local_690.hit + 0x1c);
                    *(float *)((long)local_690.ray + 0x50) = *(float *)(local_690.hit + 0x20);
                  }
                  else {
                    auVar209 = ZEXT1664(auVar209._0_16_);
                    (*local_4e0->intersectionFilterN)(&local_690);
                    auVar190 = ZEXT3264(local_5c0);
                    auVar160 = ZEXT3264(local_580);
                    auVar139 = ZEXT3264(local_660);
                    auVar211 = ZEXT3264(local_640);
                    auVar230 = ZEXT3264(local_560);
                    pre = local_6a0;
                    pPVar98 = local_698;
                    uVar96 = local_788;
                    fVar141 = (float)local_760._0_4_;
                    uVar103 = local_5e0;
                    uVar222 = uStack_5d8;
                    uVar225 = uStack_5d0;
                    uVar228 = uStack_5c8;
                    if (*local_690.valid != 0) goto LAB_015c1691;
LAB_015c17a2:
                    (ray->super_RayK<1>).tfar = (float)local_780._0_4_;
                    pre = local_6a0;
                    pPVar98 = local_698;
                    uVar96 = local_788;
                    uVar103 = local_5e0;
                    uVar222 = uStack_5d8;
                    uVar225 = uStack_5d0;
                    uVar228 = uStack_5c8;
                  }
                  auVar157 = auVar139._0_32_;
                  auVar210 = auVar160._0_32_;
                  auVar189 = auVar190._0_32_;
                  auVar203 = auVar211._0_32_;
                  *(undefined4 *)(local_520[0] + uVar94 * 4) = 0;
                  auVar115 = local_520[0];
                  fVar140 = (ray->super_RayK<1>).tfar;
                  auVar118._4_4_ = fVar140;
                  auVar118._0_4_ = fVar140;
                  auVar118._8_4_ = fVar140;
                  auVar118._12_4_ = fVar140;
                  auVar118._16_4_ = fVar140;
                  auVar118._20_4_ = fVar140;
                  auVar118._24_4_ = fVar140;
                  auVar118._28_4_ = fVar140;
                  auVar182 = vcmpps_avx(local_360,auVar118,2);
                  auVar184 = vandps_avx(auVar182,local_520[0]);
                  local_520[0] = auVar184;
                  auVar115 = auVar115 & auVar182;
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar115 >> 0x7f,0) == '\0') &&
                        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar115 >> 0xbf,0) == '\0') &&
                      (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar115[0x1f]) goto LAB_015c0555;
                  auVar138._8_4_ = 0x7f800000;
                  auVar138._0_8_ = 0x7f8000007f800000;
                  auVar138._12_4_ = 0x7f800000;
                  auVar138._16_4_ = 0x7f800000;
                  auVar138._20_4_ = 0x7f800000;
                  auVar138._24_4_ = 0x7f800000;
                  auVar138._28_4_ = 0x7f800000;
                  auVar182 = vblendvps_avx(auVar138,local_360,auVar184);
                  auVar115 = vshufps_avx(auVar182,auVar182,0xb1);
                  auVar115 = vminps_avx(auVar182,auVar115);
                  auVar132 = vshufpd_avx(auVar115,auVar115,5);
                  auVar115 = vminps_avx(auVar115,auVar132);
                  auVar132 = vpermpd_avx2(auVar115,0x4e);
                  auVar115 = vminps_avx(auVar115,auVar132);
                  auVar182 = vcmpps_avx(auVar182,auVar115,0);
                  auVar115 = auVar184 & auVar182;
                  if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0x7f,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0xbf,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar115[0x1f] < '\0') {
                    auVar184 = vandps_avx(auVar182,auVar184);
                  }
                  local_780 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                  uVar93 = vmovmskps_avx(auVar184);
                  uVar9 = 0;
                  for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                    uVar9 = uVar9 + 1;
                  }
                  uVar94 = (ulong)uVar9;
                } while( true );
              }
              fVar140 = local_180[uVar94];
              fVar119 = *(float *)((long)&local_160 + uVar94 * 4);
              fVar120 = 1.0 - fVar140;
              auVar165 = ZEXT416((uint)(fVar140 * fVar120 * 4.0));
              auVar12 = vfnmsub213ss_fma(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),auVar165);
              auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),auVar165);
              fVar120 = fVar120 * -fVar120 * 0.5;
              fVar121 = auVar12._0_4_ * 0.5;
              fVar122 = auVar165._0_4_ * 0.5;
              fVar123 = fVar140 * fVar140 * 0.5;
              auVar163._0_4_ = fVar123 * (float)local_6d0._0_4_;
              auVar163._4_4_ = fVar123 * (float)local_6d0._4_4_;
              auVar163._8_4_ = fVar123 * (float)uStack_6c8;
              auVar163._12_4_ = fVar123 * uStack_6c8._4_4_;
              auVar144._4_4_ = fVar122;
              auVar144._0_4_ = fVar122;
              auVar144._8_4_ = fVar122;
              auVar144._12_4_ = fVar122;
              auVar165 = vfmadd132ps_fma(auVar144,auVar163,local_6c0);
              auVar164._4_4_ = fVar121;
              auVar164._0_4_ = fVar121;
              auVar164._8_4_ = fVar121;
              auVar164._12_4_ = fVar121;
              auVar165 = vfmadd132ps_fma(auVar164,auVar165,local_6b0);
              auVar145._4_4_ = fVar120;
              auVar145._0_4_ = fVar120;
              auVar145._8_4_ = fVar120;
              auVar145._12_4_ = fVar120;
              auVar165 = vfmadd132ps_fma(auVar145,auVar165,*(undefined1 (*) [16])pPVar1);
              (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar94 * 4);
              uVar4 = vmovlps_avx(auVar165);
              *(undefined8 *)&(ray->Ng).field_0 = uVar4;
              fVar120 = (float)vextractps_avx(auVar165,2);
              (ray->Ng).field_0.field_0.z = fVar120;
              ray->u = fVar140;
              ray->v = fVar119;
              ray->primID = uVar95;
              ray->geomID = uVar9;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
            }
          }
LAB_015c0555:
          auVar139 = ZEXT3264(local_5a0);
          auVar160 = ZEXT3264(local_540);
        }
      }
      if (8 < (int)local_720._0_4_) {
        uStack_5d8 = uVar222;
        local_5e0 = uVar103;
        uStack_5d0 = uVar225;
        uStack_5c8 = uVar228;
        local_5c0 = auVar189;
        local_580 = auVar210;
        local_660 = auVar157;
        local_788 = uVar96;
        local_300._4_4_ = local_720._0_4_;
        local_300._0_4_ = local_720._0_4_;
        local_300._8_4_ = local_720._0_4_;
        local_300._12_4_ = local_720._0_4_;
        local_300._16_4_ = local_720._0_4_;
        local_300._20_4_ = local_720._0_4_;
        local_300._24_4_ = local_720._0_4_;
        local_300._28_4_ = local_720._0_4_;
        local_340._4_4_ = fVar141;
        local_340._0_4_ = fVar141;
        fStack_338 = fVar141;
        fStack_334 = fVar141;
        fStack_330 = fVar141;
        fStack_32c = fVar141;
        fStack_328 = fVar141;
        fStack_324 = fVar141;
        auVar165 = vpermilps_avx(local_4c0._0_16_,0xff);
        local_4e0 = auVar165._0_8_;
        uStack_4d8 = local_4e0;
        uStack_4d0 = local_4e0;
        uStack_4c8 = local_4e0;
        local_460._0_4_ = 1.0 / (float)local_460;
        local_460._4_4_ = (float)local_460;
        uStack_458._0_4_ = (float)local_460;
        uStack_458._4_4_ = (float)local_460;
        fStack_450 = (float)local_460;
        fStack_44c = (float)local_460;
        fStack_448 = (float)local_460;
        fStack_444 = (float)local_460;
        lVar101 = 8;
        local_640 = auVar203;
        local_1fc = local_720._0_4_;
LAB_015c064a:
        auVar184 = *(undefined1 (*) [32])(bspline_basis0 + lVar101 * 4 + lVar21);
        local_760 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar101 * 4);
        local_4c0 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar101 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar101 * 4);
        auVar91 = *(undefined1 (*) [28])*pauVar2;
        auVar211._0_4_ = local_400 * *(float *)*pauVar2;
        auVar211._4_4_ = fStack_3fc * *(float *)(*pauVar2 + 4);
        auVar211._8_4_ = fStack_3f8 * *(float *)(*pauVar2 + 8);
        auVar211._12_4_ = fStack_3f4 * *(float *)(*pauVar2 + 0xc);
        auVar211._16_4_ = fStack_3f0 * *(float *)(*pauVar2 + 0x10);
        auVar211._20_4_ = fStack_3ec * *(float *)(*pauVar2 + 0x14);
        auVar211._28_36_ = auVar209._28_36_;
        auVar211._24_4_ = fStack_3e8 * *(float *)(*pauVar2 + 0x18);
        auVar46._4_4_ = local_3e0._4_4_ * *(float *)(*pauVar2 + 4);
        auVar46._0_4_ = (float)local_3e0 * *(float *)*pauVar2;
        auVar46._8_4_ = (float)uStack_3d8 * *(float *)(*pauVar2 + 8);
        auVar46._12_4_ = uStack_3d8._4_4_ * *(float *)(*pauVar2 + 0xc);
        auVar46._16_4_ = (float)uStack_3d0 * *(float *)(*pauVar2 + 0x10);
        auVar46._20_4_ = uStack_3d0._4_4_ * *(float *)(*pauVar2 + 0x14);
        auVar46._24_4_ = (float)uStack_3c8 * *(float *)(*pauVar2 + 0x18);
        auVar46._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
        auVar165 = vfmadd231ps_fma(auVar211._0_32_,local_4c0,auVar139._0_32_);
        auVar12 = vfmadd231ps_fma(auVar46,local_4c0,auVar160._0_32_);
        auVar229 = auVar230._0_32_;
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_760,auVar229);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_760,local_440);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),auVar184,local_640);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar184,local_420);
        auVar182 = *(undefined1 (*) [32])(bspline_basis1 + lVar101 * 4 + lVar21);
        auVar115 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar101 * 4);
        auVar132 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar101 * 4);
        pfVar3 = (float *)(lVar21 + 0x21b1cd4 + lVar101 * 4);
        fVar124 = *pfVar3;
        fVar214 = pfVar3[1];
        fVar80 = pfVar3[2];
        fVar81 = pfVar3[3];
        fVar82 = pfVar3[4];
        fVar83 = pfVar3[5];
        fVar84 = pfVar3[6];
        auVar47._4_4_ = fStack_3fc * fVar214;
        auVar47._0_4_ = local_400 * fVar124;
        auVar47._8_4_ = fStack_3f8 * fVar80;
        auVar47._12_4_ = fStack_3f4 * fVar81;
        auVar47._16_4_ = fStack_3f0 * fVar82;
        auVar47._20_4_ = fStack_3ec * fVar83;
        auVar47._24_4_ = fStack_3e8 * fVar84;
        auVar47._28_4_ = fStack_3e4;
        auVar77._4_4_ = local_3e0._4_4_ * fVar214;
        auVar77._0_4_ = (float)local_3e0 * fVar124;
        auVar77._8_4_ = (float)uStack_3d8 * fVar80;
        auVar77._12_4_ = uStack_3d8._4_4_ * fVar81;
        auVar77._16_4_ = (float)uStack_3d0 * fVar82;
        auVar77._20_4_ = uStack_3d0._4_4_ * fVar83;
        auVar77._24_4_ = (float)uStack_3c8 * fVar84;
        auVar77._28_4_ = local_640._28_4_;
        auVar13 = vfmadd231ps_fma(auVar47,auVar132,auVar139._0_32_);
        auVar14 = vfmadd231ps_fma(auVar77,auVar132,auVar160._0_32_);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar115,auVar229);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,local_440);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar182,local_640);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar182,local_420);
        local_2a0 = ZEXT1632(auVar13);
        local_2e0 = ZEXT1632(auVar165);
        auVar193 = vsubps_avx(local_2a0,local_2e0);
        local_480 = ZEXT1632(auVar14);
        local_2c0 = ZEXT1632(auVar12);
        auVar116 = vsubps_avx(local_480,local_2c0);
        auVar78._4_4_ = auVar12._4_4_ * auVar193._4_4_;
        auVar78._0_4_ = auVar12._0_4_ * auVar193._0_4_;
        auVar78._8_4_ = auVar12._8_4_ * auVar193._8_4_;
        auVar78._12_4_ = auVar12._12_4_ * auVar193._12_4_;
        auVar78._16_4_ = auVar193._16_4_ * 0.0;
        auVar78._20_4_ = auVar193._20_4_ * 0.0;
        auVar78._24_4_ = auVar193._24_4_ * 0.0;
        auVar78._28_4_ = local_440._28_4_;
        fVar141 = auVar116._0_4_;
        auVar160._0_4_ = auVar165._0_4_ * fVar141;
        fVar140 = auVar116._4_4_;
        auVar160._4_4_ = auVar165._4_4_ * fVar140;
        fVar119 = auVar116._8_4_;
        auVar160._8_4_ = auVar165._8_4_ * fVar119;
        fVar120 = auVar116._12_4_;
        auVar160._12_4_ = auVar165._12_4_ * fVar120;
        fVar121 = auVar116._16_4_;
        auVar160._16_4_ = fVar121 * 0.0;
        fVar122 = auVar116._20_4_;
        auVar160._20_4_ = fVar122 * 0.0;
        fVar123 = auVar116._24_4_;
        auVar160._28_36_ = auVar139._28_36_;
        auVar160._24_4_ = fVar123 * 0.0;
        auVar209 = ZEXT3264(*pauVar2);
        auVar11 = vsubps_avx(auVar78,auVar160._0_32_);
        auVar183._0_4_ = auVar91._0_4_ * (float)local_e0;
        auVar183._4_4_ = auVar91._4_4_ * local_e0._4_4_;
        auVar183._8_4_ = auVar91._8_4_ * (float)uStack_d8;
        auVar183._12_4_ = auVar91._12_4_ * uStack_d8._4_4_;
        auVar183._16_4_ = auVar91._16_4_ * (float)uStack_d0;
        auVar183._20_4_ = auVar91._20_4_ * uStack_d0._4_4_;
        auVar183._24_4_ = auVar91._24_4_ * (float)uStack_c8;
        auVar183._28_4_ = 0;
        auVar165 = vfmadd231ps_fma(auVar183,local_4c0,local_c0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_760,local_a0);
        auVar165 = vfmadd231ps_fma(ZEXT1632(auVar165),local_80,auVar184);
        auVar48._4_4_ = fVar214 * local_e0._4_4_;
        auVar48._0_4_ = fVar124 * (float)local_e0;
        auVar48._8_4_ = fVar80 * (float)uStack_d8;
        auVar48._12_4_ = fVar81 * uStack_d8._4_4_;
        auVar48._16_4_ = fVar82 * (float)uStack_d0;
        auVar48._20_4_ = fVar83 * uStack_d0._4_4_;
        auVar48._24_4_ = fVar84 * (float)uStack_c8;
        auVar48._28_4_ = uStack_c8._4_4_;
        auVar12 = vfmadd231ps_fma(auVar48,auVar132,local_c0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar115,local_a0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar182,local_80);
        auVar49._4_4_ = fVar140 * fVar140;
        auVar49._0_4_ = fVar141 * fVar141;
        auVar49._8_4_ = fVar119 * fVar119;
        auVar49._12_4_ = fVar120 * fVar120;
        auVar49._16_4_ = fVar121 * fVar121;
        auVar49._20_4_ = fVar122 * fVar122;
        auVar49._24_4_ = fVar123 * fVar123;
        auVar49._28_4_ = local_760._28_4_;
        auVar13 = vfmadd231ps_fma(auVar49,auVar193,auVar193);
        _local_4a0 = ZEXT1632(auVar12);
        auVar200 = vmaxps_avx(ZEXT1632(auVar165),_local_4a0);
        auVar197._0_4_ = auVar200._0_4_ * auVar200._0_4_ * auVar13._0_4_;
        auVar197._4_4_ = auVar200._4_4_ * auVar200._4_4_ * auVar13._4_4_;
        auVar197._8_4_ = auVar200._8_4_ * auVar200._8_4_ * auVar13._8_4_;
        auVar197._12_4_ = auVar200._12_4_ * auVar200._12_4_ * auVar13._12_4_;
        auVar197._16_4_ = auVar200._16_4_ * auVar200._16_4_ * 0.0;
        auVar197._20_4_ = auVar200._20_4_ * auVar200._20_4_ * 0.0;
        auVar197._24_4_ = auVar200._24_4_ * auVar200._24_4_ * 0.0;
        auVar197._28_4_ = 0;
        auVar50._4_4_ = auVar11._4_4_ * auVar11._4_4_;
        auVar50._0_4_ = auVar11._0_4_ * auVar11._0_4_;
        auVar50._8_4_ = auVar11._8_4_ * auVar11._8_4_;
        auVar50._12_4_ = auVar11._12_4_ * auVar11._12_4_;
        auVar50._16_4_ = auVar11._16_4_ * auVar11._16_4_;
        auVar50._20_4_ = auVar11._20_4_ * auVar11._20_4_;
        auVar50._24_4_ = auVar11._24_4_ * auVar11._24_4_;
        auVar50._28_4_ = auVar11._28_4_;
        auVar200 = vcmpps_avx(auVar50,auVar197,2);
        local_200 = (int)lVar101;
        auVar198._4_4_ = local_200;
        auVar198._0_4_ = local_200;
        auVar198._8_4_ = local_200;
        auVar198._12_4_ = local_200;
        auVar198._16_4_ = local_200;
        auVar198._20_4_ = local_200;
        auVar198._24_4_ = local_200;
        auVar198._28_4_ = local_200;
        auVar11 = vpor_avx2(auVar198,_DAT_01fe9900);
        auVar109 = vpcmpgtd_avx2(local_300,auVar11);
        auVar11 = auVar109 & auVar200;
        if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0x7f,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar11[0x1f]) {
          auVar230 = ZEXT3264(auVar229);
        }
        else {
          local_320 = vandps_avx(auVar109,auVar200);
          auVar51._4_4_ = local_5e0._4_4_ * fVar214;
          auVar51._0_4_ = (float)local_5e0 * fVar124;
          auVar51._8_4_ = (float)uStack_5d8 * fVar80;
          auVar51._12_4_ = uStack_5d8._4_4_ * fVar81;
          auVar51._16_4_ = (float)uStack_5d0 * fVar82;
          auVar51._20_4_ = uStack_5d0._4_4_ * fVar83;
          auVar51._24_4_ = (float)uStack_5c8 * fVar84;
          auVar51._28_4_ = auVar200._28_4_;
          auVar12 = vfmadd213ps_fma(auVar132,local_5c0,auVar51);
          auVar12 = vfmadd213ps_fma(auVar115,local_580,ZEXT1632(auVar12));
          auVar12 = vfmadd132ps_fma(auVar182,ZEXT1632(auVar12),local_660);
          auVar52._4_4_ = local_5e0._4_4_ * auVar91._4_4_;
          auVar52._0_4_ = (float)local_5e0 * auVar91._0_4_;
          auVar52._8_4_ = (float)uStack_5d8 * auVar91._8_4_;
          auVar52._12_4_ = uStack_5d8._4_4_ * auVar91._12_4_;
          auVar52._16_4_ = (float)uStack_5d0 * auVar91._16_4_;
          auVar52._20_4_ = uStack_5d0._4_4_ * auVar91._20_4_;
          auVar52._24_4_ = (float)uStack_5c8 * auVar91._24_4_;
          auVar52._28_4_ = auVar200._28_4_;
          auVar13 = vfmadd213ps_fma(local_4c0,local_5c0,auVar52);
          auVar13 = vfmadd213ps_fma(local_760,local_580,ZEXT1632(auVar13));
          auVar182 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar101 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar101 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar101 * 4);
          pfVar3 = (float *)(lVar21 + 0x21b0ac4 + lVar101 * 4);
          fVar141 = *pfVar3;
          fVar140 = pfVar3[1];
          fVar119 = pfVar3[2];
          fVar120 = pfVar3[3];
          fVar121 = pfVar3[4];
          fVar122 = pfVar3[5];
          fVar123 = pfVar3[6];
          auVar53._4_4_ = fStack_3fc * fVar140;
          auVar53._0_4_ = local_400 * fVar141;
          auVar53._8_4_ = fStack_3f8 * fVar119;
          auVar53._12_4_ = fStack_3f4 * fVar120;
          auVar53._16_4_ = fStack_3f0 * fVar121;
          auVar53._20_4_ = fStack_3ec * fVar122;
          auVar53._24_4_ = fStack_3e8 * fVar123;
          auVar53._28_4_ = auVar116._28_4_;
          auVar54._4_4_ = fVar140 * local_3e0._4_4_;
          auVar54._0_4_ = fVar141 * (float)local_3e0;
          auVar54._8_4_ = fVar119 * (float)uStack_3d8;
          auVar54._12_4_ = fVar120 * uStack_3d8._4_4_;
          auVar54._16_4_ = fVar121 * (float)uStack_3d0;
          auVar54._20_4_ = fVar122 * uStack_3d0._4_4_;
          auVar54._24_4_ = fVar123 * (float)uStack_3c8;
          auVar54._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar55._4_4_ = fVar140 * local_5e0._4_4_;
          auVar55._0_4_ = fVar141 * (float)local_5e0;
          auVar55._8_4_ = fVar119 * (float)uStack_5d8;
          auVar55._12_4_ = fVar120 * uStack_5d8._4_4_;
          auVar55._16_4_ = fVar121 * (float)uStack_5d0;
          auVar55._20_4_ = fVar122 * uStack_5d0._4_4_;
          auVar55._24_4_ = fVar123 * (float)uStack_5c8;
          auVar55._28_4_ = pfVar3[7];
          auVar14 = vfmadd231ps_fma(auVar53,auVar132,local_5a0);
          auVar15 = vfmadd231ps_fma(auVar54,auVar132,local_540);
          auVar16 = vfmadd231ps_fma(auVar55,local_5c0,auVar132);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,auVar229);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar115,local_440);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_580,auVar115);
          local_4c0 = auVar193;
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar182,local_640);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar182,local_420);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar182,local_660);
          pfVar3 = (float *)(lVar21 + 0x21b2ee4 + lVar101 * 4);
          fVar141 = *pfVar3;
          fVar140 = pfVar3[1];
          fVar119 = pfVar3[2];
          fVar120 = pfVar3[3];
          fVar121 = pfVar3[4];
          fVar122 = pfVar3[5];
          fVar123 = pfVar3[6];
          auVar56._4_4_ = fStack_3fc * fVar140;
          auVar56._0_4_ = local_400 * fVar141;
          auVar56._8_4_ = fStack_3f8 * fVar119;
          auVar56._12_4_ = fStack_3f4 * fVar120;
          auVar56._16_4_ = fStack_3f0 * fVar121;
          auVar56._20_4_ = fStack_3ec * fVar122;
          auVar56._24_4_ = fStack_3e8 * fVar123;
          auVar56._28_4_ = fStack_3e4;
          auVar57._4_4_ = local_3e0._4_4_ * fVar140;
          auVar57._0_4_ = (float)local_3e0 * fVar141;
          auVar57._8_4_ = (float)uStack_3d8 * fVar119;
          auVar57._12_4_ = uStack_3d8._4_4_ * fVar120;
          auVar57._16_4_ = (float)uStack_3d0 * fVar121;
          auVar57._20_4_ = uStack_3d0._4_4_ * fVar122;
          auVar57._24_4_ = (float)uStack_3c8 * fVar123;
          auVar57._28_4_ = local_5c0._28_4_;
          auVar58._4_4_ = fVar140 * local_5e0._4_4_;
          auVar58._0_4_ = fVar141 * (float)local_5e0;
          auVar58._8_4_ = fVar119 * (float)uStack_5d8;
          auVar58._12_4_ = fVar120 * uStack_5d8._4_4_;
          auVar58._16_4_ = fVar121 * (float)uStack_5d0;
          auVar58._20_4_ = fVar122 * uStack_5d0._4_4_;
          auVar58._24_4_ = fVar123 * (float)uStack_5c8;
          auVar58._28_4_ = pfVar3[7];
          auVar182 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar101 * 4);
          auVar107 = vfmadd231ps_fma(auVar56,auVar182,local_5a0);
          auVar106 = vfmadd231ps_fma(auVar57,auVar182,local_540);
          auVar142 = vfmadd231ps_fma(auVar58,auVar182,local_5c0);
          auVar182 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar101 * 4);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar182,auVar229);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar182,local_440);
          auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),local_580,auVar182);
          auVar182 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar101 * 4);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar182,local_640);
          auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar182,local_420);
          auVar142 = vfmadd231ps_fma(ZEXT1632(auVar142),local_660,auVar182);
          auVar199._8_4_ = 0x7fffffff;
          auVar199._0_8_ = 0x7fffffff7fffffff;
          auVar199._12_4_ = 0x7fffffff;
          auVar199._16_4_ = 0x7fffffff;
          auVar199._20_4_ = 0x7fffffff;
          auVar199._24_4_ = 0x7fffffff;
          auVar199._28_4_ = 0x7fffffff;
          auVar182 = vandps_avx(ZEXT1632(auVar14),auVar199);
          auVar115 = vandps_avx(ZEXT1632(auVar15),auVar199);
          auVar115 = vmaxps_avx(auVar182,auVar115);
          auVar182 = vandps_avx(ZEXT1632(auVar16),auVar199);
          auVar182 = vmaxps_avx(auVar115,auVar182);
          auVar182 = vcmpps_avx(auVar182,_local_340,1);
          auVar132 = vblendvps_avx(ZEXT1632(auVar14),auVar193,auVar182);
          auVar200 = vblendvps_avx(ZEXT1632(auVar15),auVar116,auVar182);
          auVar182 = vandps_avx(ZEXT1632(auVar107),auVar199);
          auVar115 = vandps_avx(ZEXT1632(auVar106),auVar199);
          auVar115 = vmaxps_avx(auVar182,auVar115);
          auVar182 = vandps_avx(auVar199,ZEXT1632(auVar142));
          auVar182 = vmaxps_avx(auVar115,auVar182);
          auVar115 = vcmpps_avx(auVar182,_local_340,1);
          auVar182 = vblendvps_avx(ZEXT1632(auVar107),auVar193,auVar115);
          auVar115 = vblendvps_avx(ZEXT1632(auVar106),auVar116,auVar115);
          auVar13 = vfmadd213ps_fma(auVar184,local_660,ZEXT1632(auVar13));
          auVar14 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar200,auVar200);
          auVar184 = vrsqrtps_avx(ZEXT1632(auVar14));
          fVar141 = auVar184._0_4_;
          fVar140 = auVar184._4_4_;
          fVar119 = auVar184._8_4_;
          fVar120 = auVar184._12_4_;
          fVar121 = auVar184._16_4_;
          fVar122 = auVar184._20_4_;
          fVar123 = auVar184._24_4_;
          auVar59._4_4_ = fVar140 * fVar140 * fVar140 * auVar14._4_4_ * -0.5;
          auVar59._0_4_ = fVar141 * fVar141 * fVar141 * auVar14._0_4_ * -0.5;
          auVar59._8_4_ = fVar119 * fVar119 * fVar119 * auVar14._8_4_ * -0.5;
          auVar59._12_4_ = fVar120 * fVar120 * fVar120 * auVar14._12_4_ * -0.5;
          auVar59._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar59._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar59._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar59._28_4_ = 0;
          auVar218._8_4_ = 0x3fc00000;
          auVar218._0_8_ = 0x3fc000003fc00000;
          auVar218._12_4_ = 0x3fc00000;
          auVar218._16_4_ = 0x3fc00000;
          auVar218._20_4_ = 0x3fc00000;
          auVar218._24_4_ = 0x3fc00000;
          auVar218._28_4_ = 0x3fc00000;
          auVar14 = vfmadd231ps_fma(auVar59,auVar218,auVar184);
          fVar141 = auVar14._0_4_;
          fVar140 = auVar14._4_4_;
          auVar60._4_4_ = auVar200._4_4_ * fVar140;
          auVar60._0_4_ = auVar200._0_4_ * fVar141;
          fVar119 = auVar14._8_4_;
          auVar60._8_4_ = auVar200._8_4_ * fVar119;
          fVar120 = auVar14._12_4_;
          auVar60._12_4_ = auVar200._12_4_ * fVar120;
          auVar60._16_4_ = auVar200._16_4_ * 0.0;
          auVar60._20_4_ = auVar200._20_4_ * 0.0;
          auVar60._24_4_ = auVar200._24_4_ * 0.0;
          auVar60._28_4_ = auVar184._28_4_;
          auVar61._4_4_ = fVar140 * -auVar132._4_4_;
          auVar61._0_4_ = fVar141 * -auVar132._0_4_;
          auVar61._8_4_ = fVar119 * -auVar132._8_4_;
          auVar61._12_4_ = fVar120 * -auVar132._12_4_;
          auVar61._16_4_ = -auVar132._16_4_ * 0.0;
          auVar61._20_4_ = -auVar132._20_4_ * 0.0;
          auVar61._24_4_ = -auVar132._24_4_ * 0.0;
          auVar61._28_4_ = auVar200._28_4_;
          auVar14 = vfmadd213ps_fma(auVar182,auVar182,ZEXT832(0) << 0x20);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar115,auVar115);
          auVar184 = vrsqrtps_avx(ZEXT1632(auVar14));
          auVar62._28_4_ = auVar193._28_4_;
          auVar62._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * 0.0,
                                  CONCAT48(fVar119 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          fVar141 = auVar184._0_4_;
          fVar140 = auVar184._4_4_;
          fVar119 = auVar184._8_4_;
          fVar120 = auVar184._12_4_;
          fVar121 = auVar184._16_4_;
          fVar122 = auVar184._20_4_;
          fVar123 = auVar184._24_4_;
          auVar63._4_4_ = fVar140 * fVar140 * fVar140 * auVar14._4_4_ * -0.5;
          auVar63._0_4_ = fVar141 * fVar141 * fVar141 * auVar14._0_4_ * -0.5;
          auVar63._8_4_ = fVar119 * fVar119 * fVar119 * auVar14._8_4_ * -0.5;
          auVar63._12_4_ = fVar120 * fVar120 * fVar120 * auVar14._12_4_ * -0.5;
          auVar63._16_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar63._20_4_ = fVar122 * fVar122 * fVar122 * -0.0;
          auVar63._24_4_ = fVar123 * fVar123 * fVar123 * -0.0;
          auVar63._28_4_ = 0;
          auVar14 = vfmadd231ps_fma(auVar63,auVar218,auVar184);
          fVar141 = auVar14._0_4_;
          fVar140 = auVar14._4_4_;
          auVar64._4_4_ = auVar115._4_4_ * fVar140;
          auVar64._0_4_ = auVar115._0_4_ * fVar141;
          fVar119 = auVar14._8_4_;
          auVar64._8_4_ = auVar115._8_4_ * fVar119;
          fVar120 = auVar14._12_4_;
          auVar64._12_4_ = auVar115._12_4_ * fVar120;
          auVar64._16_4_ = auVar115._16_4_ * 0.0;
          auVar64._20_4_ = auVar115._20_4_ * 0.0;
          auVar64._24_4_ = auVar115._24_4_ * 0.0;
          auVar64._28_4_ = 0;
          auVar65._4_4_ = fVar140 * -auVar182._4_4_;
          auVar65._0_4_ = fVar141 * -auVar182._0_4_;
          auVar65._8_4_ = fVar119 * -auVar182._8_4_;
          auVar65._12_4_ = fVar120 * -auVar182._12_4_;
          auVar65._16_4_ = -auVar182._16_4_ * 0.0;
          auVar65._20_4_ = -auVar182._20_4_ * 0.0;
          auVar65._24_4_ = -auVar182._24_4_ * 0.0;
          auVar65._28_4_ = auVar184._28_4_;
          auVar66._28_4_ = 0xbf000000;
          auVar66._0_28_ =
               ZEXT1628(CONCAT412(fVar120 * 0.0,
                                  CONCAT48(fVar119 * 0.0,CONCAT44(fVar140 * 0.0,fVar141 * 0.0))));
          auVar14 = vfmadd213ps_fma(auVar60,ZEXT1632(auVar165),local_2e0);
          auVar184 = ZEXT1632(auVar165);
          auVar15 = vfmadd213ps_fma(auVar61,auVar184,local_2c0);
          auVar16 = vfmadd213ps_fma(auVar62,auVar184,ZEXT1632(auVar13));
          auVar126 = vfnmadd213ps_fma(auVar60,auVar184,local_2e0);
          auVar107 = vfmadd213ps_fma(auVar64,_local_4a0,local_2a0);
          auVar105 = vfnmadd213ps_fma(auVar61,auVar184,local_2c0);
          auVar106 = vfmadd213ps_fma(auVar65,_local_4a0,local_480);
          local_720 = ZEXT1632(auVar165);
          auVar162 = vfnmadd231ps_fma(ZEXT1632(auVar13),local_720,auVar62);
          auVar13 = vfmadd213ps_fma(auVar66,_local_4a0,ZEXT1632(auVar12));
          auVar127 = vfnmadd213ps_fma(auVar64,_local_4a0,local_2a0);
          auVar155 = vfnmadd213ps_fma(auVar65,_local_4a0,local_480);
          auVar104 = vfnmadd231ps_fma(ZEXT1632(auVar12),_local_4a0,auVar66);
          auVar184 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar105));
          auVar182 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar162));
          auVar185._0_4_ = auVar184._0_4_ * auVar162._0_4_;
          auVar185._4_4_ = auVar184._4_4_ * auVar162._4_4_;
          auVar185._8_4_ = auVar184._8_4_ * auVar162._8_4_;
          auVar185._12_4_ = auVar184._12_4_ * auVar162._12_4_;
          auVar185._16_4_ = auVar184._16_4_ * 0.0;
          auVar185._20_4_ = auVar184._20_4_ * 0.0;
          auVar185._24_4_ = auVar184._24_4_ * 0.0;
          auVar185._28_4_ = 0;
          auVar142 = vfmsub231ps_fma(auVar185,ZEXT1632(auVar105),auVar182);
          auVar67._4_4_ = auVar126._4_4_ * auVar182._4_4_;
          auVar67._0_4_ = auVar126._0_4_ * auVar182._0_4_;
          auVar67._8_4_ = auVar126._8_4_ * auVar182._8_4_;
          auVar67._12_4_ = auVar126._12_4_ * auVar182._12_4_;
          auVar67._16_4_ = auVar182._16_4_ * 0.0;
          auVar67._20_4_ = auVar182._20_4_ * 0.0;
          auVar67._24_4_ = auVar182._24_4_ * 0.0;
          auVar67._28_4_ = auVar182._28_4_;
          auVar200 = ZEXT1632(auVar126);
          auVar182 = vsubps_avx(ZEXT1632(auVar107),auVar200);
          auVar116 = ZEXT1632(auVar162);
          auVar12 = vfmsub231ps_fma(auVar67,auVar116,auVar182);
          auVar68._4_4_ = auVar105._4_4_ * auVar182._4_4_;
          auVar68._0_4_ = auVar105._0_4_ * auVar182._0_4_;
          auVar68._8_4_ = auVar105._8_4_ * auVar182._8_4_;
          auVar68._12_4_ = auVar105._12_4_ * auVar182._12_4_;
          auVar68._16_4_ = auVar182._16_4_ * 0.0;
          auVar68._20_4_ = auVar182._20_4_ * 0.0;
          auVar68._24_4_ = auVar182._24_4_ * 0.0;
          auVar68._28_4_ = auVar182._28_4_;
          auVar126 = vfmsub231ps_fma(auVar68,auVar200,auVar184);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar142));
          auVar11 = vcmpps_avx(ZEXT1632(auVar12),ZEXT832(0) << 0x20,2);
          local_760 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar14),auVar11);
          local_700._0_32_ = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar15),auVar11);
          auVar184 = vblendvps_avx(ZEXT1632(auVar104),ZEXT1632(auVar16),auVar11);
          auVar182 = vblendvps_avx(auVar200,ZEXT1632(auVar107),auVar11);
          auVar115 = vblendvps_avx(ZEXT1632(auVar105),ZEXT1632(auVar106),auVar11);
          auVar132 = vblendvps_avx(auVar116,ZEXT1632(auVar13),auVar11);
          auVar200 = vblendvps_avx(ZEXT1632(auVar107),auVar200,auVar11);
          auVar193 = vblendvps_avx(ZEXT1632(auVar106),ZEXT1632(auVar105),auVar11);
          auVar12 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
          local_780 = ZEXT1632(auVar12);
          auVar116 = vblendvps_avx(ZEXT1632(auVar13),auVar116,auVar11);
          auVar200 = vsubps_avx(auVar200,local_760);
          auVar193 = vsubps_avx(auVar193,local_700._0_32_);
          auVar109 = vsubps_avx(auVar116,auVar184);
          auVar229 = vsubps_avx(local_760,auVar182);
          auVar20 = vsubps_avx(local_700._0_32_,auVar115);
          auVar19 = vsubps_avx(auVar184,auVar132);
          auVar178._0_4_ = auVar109._0_4_ * local_760._0_4_;
          auVar178._4_4_ = auVar109._4_4_ * local_760._4_4_;
          auVar178._8_4_ = auVar109._8_4_ * local_760._8_4_;
          auVar178._12_4_ = auVar109._12_4_ * local_760._12_4_;
          auVar178._16_4_ = auVar109._16_4_ * local_760._16_4_;
          auVar178._20_4_ = auVar109._20_4_ * local_760._20_4_;
          auVar178._24_4_ = auVar109._24_4_ * local_760._24_4_;
          auVar178._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar178,auVar184,auVar200);
          auVar69._4_4_ = auVar200._4_4_ * local_700._4_4_;
          auVar69._0_4_ = auVar200._0_4_ * local_700._0_4_;
          auVar69._8_4_ = auVar200._8_4_ * local_700._8_4_;
          auVar69._12_4_ = auVar200._12_4_ * local_700._12_4_;
          auVar69._16_4_ = auVar200._16_4_ * local_700._16_4_;
          auVar69._20_4_ = auVar200._20_4_ * local_700._20_4_;
          auVar69._24_4_ = auVar200._24_4_ * local_700._24_4_;
          auVar69._28_4_ = auVar116._28_4_;
          auVar14 = vfmsub231ps_fma(auVar69,local_760,auVar193);
          auVar209 = ZEXT864(0) << 0x20;
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar179._0_4_ = auVar193._0_4_ * auVar184._0_4_;
          auVar179._4_4_ = auVar193._4_4_ * auVar184._4_4_;
          auVar179._8_4_ = auVar193._8_4_ * auVar184._8_4_;
          auVar179._12_4_ = auVar193._12_4_ * auVar184._12_4_;
          auVar179._16_4_ = auVar193._16_4_ * auVar184._16_4_;
          auVar179._20_4_ = auVar193._20_4_ * auVar184._20_4_;
          auVar179._24_4_ = auVar193._24_4_ * auVar184._24_4_;
          auVar179._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar179,local_700._0_32_,auVar109);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar180._0_4_ = auVar19._0_4_ * auVar182._0_4_;
          auVar180._4_4_ = auVar19._4_4_ * auVar182._4_4_;
          auVar180._8_4_ = auVar19._8_4_ * auVar182._8_4_;
          auVar180._12_4_ = auVar19._12_4_ * auVar182._12_4_;
          auVar180._16_4_ = auVar19._16_4_ * auVar182._16_4_;
          auVar180._20_4_ = auVar19._20_4_ * auVar182._20_4_;
          auVar180._24_4_ = auVar19._24_4_ * auVar182._24_4_;
          auVar180._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar180,auVar229,auVar132);
          auVar70._4_4_ = auVar20._4_4_ * auVar132._4_4_;
          auVar70._0_4_ = auVar20._0_4_ * auVar132._0_4_;
          auVar70._8_4_ = auVar20._8_4_ * auVar132._8_4_;
          auVar70._12_4_ = auVar20._12_4_ * auVar132._12_4_;
          auVar70._16_4_ = auVar20._16_4_ * auVar132._16_4_;
          auVar70._20_4_ = auVar20._20_4_ * auVar132._20_4_;
          auVar70._24_4_ = auVar20._24_4_ * auVar132._24_4_;
          auVar70._28_4_ = auVar132._28_4_;
          auVar15 = vfmsub231ps_fma(auVar70,auVar115,auVar19);
          auVar71._4_4_ = auVar229._4_4_ * auVar115._4_4_;
          auVar71._0_4_ = auVar229._0_4_ * auVar115._0_4_;
          auVar71._8_4_ = auVar229._8_4_ * auVar115._8_4_;
          auVar71._12_4_ = auVar229._12_4_ * auVar115._12_4_;
          auVar71._16_4_ = auVar229._16_4_ * auVar115._16_4_;
          auVar71._20_4_ = auVar229._20_4_ * auVar115._20_4_;
          auVar71._24_4_ = auVar229._24_4_ * auVar115._24_4_;
          auVar71._28_4_ = auVar115._28_4_;
          auVar16 = vfmsub231ps_fma(auVar71,auVar20,auVar182);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar182 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
          auVar182 = vcmpps_avx(auVar182,ZEXT832(0) << 0x20,2);
          auVar13 = vpackssdw_avx(auVar182._0_16_,auVar182._16_16_);
          auVar12 = vpand_avx(auVar13,auVar12);
          auVar182 = vpmovsxwd_avx2(auVar12);
          if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar182 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar182 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar182 >> 0x7f,0) == '\0') &&
                (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar182 >> 0xbf,0) == '\0') &&
              (auVar182 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar182[0x1f]) {
LAB_015c10f1:
            auVar159._8_8_ = local_520[1]._8_8_;
            auVar159._0_8_ = local_520[1]._0_8_;
            auVar159._16_8_ = local_520[1]._16_8_;
            auVar159._24_8_ = local_520[1]._24_8_;
          }
          else {
            auVar72._4_4_ = auVar193._4_4_ * auVar19._4_4_;
            auVar72._0_4_ = auVar193._0_4_ * auVar19._0_4_;
            auVar72._8_4_ = auVar193._8_4_ * auVar19._8_4_;
            auVar72._12_4_ = auVar193._12_4_ * auVar19._12_4_;
            auVar72._16_4_ = auVar193._16_4_ * auVar19._16_4_;
            auVar72._20_4_ = auVar193._20_4_ * auVar19._20_4_;
            auVar72._24_4_ = auVar193._24_4_ * auVar19._24_4_;
            auVar72._28_4_ = auVar182._28_4_;
            auVar106 = vfmsub231ps_fma(auVar72,auVar20,auVar109);
            auVar186._0_4_ = auVar229._0_4_ * auVar109._0_4_;
            auVar186._4_4_ = auVar229._4_4_ * auVar109._4_4_;
            auVar186._8_4_ = auVar229._8_4_ * auVar109._8_4_;
            auVar186._12_4_ = auVar229._12_4_ * auVar109._12_4_;
            auVar186._16_4_ = auVar229._16_4_ * auVar109._16_4_;
            auVar186._20_4_ = auVar229._20_4_ * auVar109._20_4_;
            auVar186._24_4_ = auVar229._24_4_ * auVar109._24_4_;
            auVar186._28_4_ = 0;
            auVar107 = vfmsub231ps_fma(auVar186,auVar200,auVar19);
            auVar73._4_4_ = auVar200._4_4_ * auVar20._4_4_;
            auVar73._0_4_ = auVar200._0_4_ * auVar20._0_4_;
            auVar73._8_4_ = auVar200._8_4_ * auVar20._8_4_;
            auVar73._12_4_ = auVar200._12_4_ * auVar20._12_4_;
            auVar73._16_4_ = auVar200._16_4_ * auVar20._16_4_;
            auVar73._20_4_ = auVar200._20_4_ * auVar20._20_4_;
            auVar73._24_4_ = auVar200._24_4_ * auVar20._24_4_;
            auVar73._28_4_ = auVar20._28_4_;
            auVar142 = vfmsub231ps_fma(auVar73,auVar229,auVar193);
            auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar107),ZEXT1632(auVar142));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar106),ZEXT832(0) << 0x20);
            auVar182 = vrcpps_avx(ZEXT1632(auVar16));
            auVar208._8_4_ = 0x3f800000;
            auVar208._0_8_ = 0x3f8000003f800000;
            auVar208._12_4_ = 0x3f800000;
            auVar208._16_4_ = 0x3f800000;
            auVar208._20_4_ = 0x3f800000;
            auVar208._24_4_ = 0x3f800000;
            auVar208._28_4_ = 0x3f800000;
            auVar209 = ZEXT3264(auVar208);
            auVar13 = vfnmadd213ps_fma(auVar182,ZEXT1632(auVar16),auVar208);
            auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar182,auVar182);
            auVar74._4_4_ = auVar142._4_4_ * auVar184._4_4_;
            auVar74._0_4_ = auVar142._0_4_ * auVar184._0_4_;
            auVar74._8_4_ = auVar142._8_4_ * auVar184._8_4_;
            auVar74._12_4_ = auVar142._12_4_ * auVar184._12_4_;
            auVar74._16_4_ = auVar184._16_4_ * 0.0;
            auVar74._20_4_ = auVar184._20_4_ * 0.0;
            auVar74._24_4_ = auVar184._24_4_ * 0.0;
            auVar74._28_4_ = auVar184._28_4_;
            auVar107 = vfmadd231ps_fma(auVar74,ZEXT1632(auVar107),local_700._0_32_);
            auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT1632(auVar106),local_760);
            fVar140 = auVar13._0_4_;
            fVar119 = auVar13._4_4_;
            fVar120 = auVar13._8_4_;
            fVar121 = auVar13._12_4_;
            auVar115 = ZEXT1632(CONCAT412(fVar121 * auVar107._12_4_,
                                          CONCAT48(fVar120 * auVar107._8_4_,
                                                   CONCAT44(fVar119 * auVar107._4_4_,
                                                            fVar140 * auVar107._0_4_))));
            fVar141 = (ray->super_RayK<1>).tfar;
            auVar158._4_4_ = fVar141;
            auVar158._0_4_ = fVar141;
            auVar158._8_4_ = fVar141;
            auVar158._12_4_ = fVar141;
            auVar158._16_4_ = fVar141;
            auVar158._20_4_ = fVar141;
            auVar158._24_4_ = fVar141;
            auVar158._28_4_ = fVar141;
            auVar90._8_8_ = uStack_4d8;
            auVar90._0_8_ = local_4e0;
            auVar90._16_8_ = uStack_4d0;
            auVar90._24_8_ = uStack_4c8;
            auVar184 = vcmpps_avx(auVar90,auVar115,2);
            auVar182 = vcmpps_avx(auVar115,auVar158,2);
            auVar184 = vandps_avx(auVar182,auVar184);
            auVar13 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
            auVar12 = vpand_avx(auVar12,auVar13);
            auVar184 = vpmovsxwd_avx2(auVar12);
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar184 >> 0x7f,0) == '\0') &&
                  (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar184 >> 0xbf,0) == '\0') &&
                (auVar184 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar184[0x1f]) goto LAB_015c10f1;
            auVar184 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
            auVar13 = vpackssdw_avx(auVar184._0_16_,auVar184._16_16_);
            auVar12 = vpand_avx(auVar12,auVar13);
            auVar184 = vpmovsxwd_avx2(auVar12);
            auVar159._8_8_ = local_520[1]._8_8_;
            auVar159._0_8_ = local_520[1]._0_8_;
            auVar159._16_8_ = local_520[1]._16_8_;
            auVar159._24_8_ = local_520[1]._24_8_;
            if ((((((((auVar184 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar184 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar184 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar184 >> 0x7f,0) != '\0') ||
                  (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar184 >> 0xbf,0) != '\0') ||
                (auVar184 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar184[0x1f] < '\0') {
              auVar132 = ZEXT1632(CONCAT412(fVar121 * auVar14._12_4_,
                                            CONCAT48(fVar120 * auVar14._8_4_,
                                                     CONCAT44(fVar119 * auVar14._4_4_,
                                                              fVar140 * auVar14._0_4_))));
              auVar75._28_4_ = SUB84(local_520[1]._24_8_,4);
              auVar75._0_28_ =
                   ZEXT1628(CONCAT412(fVar121 * auVar15._12_4_,
                                      CONCAT48(fVar120 * auVar15._8_4_,
                                               CONCAT44(fVar119 * auVar15._4_4_,
                                                        fVar140 * auVar15._0_4_))));
              auVar194._8_4_ = 0x3f800000;
              auVar194._0_8_ = 0x3f8000003f800000;
              auVar194._12_4_ = 0x3f800000;
              auVar194._16_4_ = 0x3f800000;
              auVar194._20_4_ = 0x3f800000;
              auVar194._24_4_ = 0x3f800000;
              auVar194._28_4_ = 0x3f800000;
              auVar182 = vsubps_avx(auVar194,auVar132);
              local_100 = vblendvps_avx(auVar182,auVar132,auVar11);
              auVar182 = vsubps_avx(auVar194,auVar75);
              local_3c0 = vblendvps_avx(auVar182,auVar75,auVar11);
              local_3a0 = auVar115;
              auVar159 = auVar184;
            }
          }
          auVar230 = ZEXT3264(local_560);
          if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar159 >> 0x7f,0) != '\0') ||
                (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar159 >> 0xbf,0) != '\0') ||
              (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar159[0x1f] < '\0') {
            auVar184 = vsubps_avx(_local_4a0,local_720);
            auVar12 = vfmadd213ps_fma(auVar184,local_100,local_720);
            fVar141 = pre->depth_scale;
            auVar76._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar141;
            auVar76._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar141;
            auVar76._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar141;
            auVar76._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar141;
            auVar76._16_4_ = fVar141 * 0.0;
            auVar76._20_4_ = fVar141 * 0.0;
            auVar76._24_4_ = fVar141 * 0.0;
            auVar76._28_4_ = fVar141;
            auVar184 = vcmpps_avx(local_3a0,auVar76,6);
            auVar182 = auVar159 & auVar184;
            if ((((((((auVar182 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar182 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar182 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar182 >> 0x7f,0) != '\0') ||
                  (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar182 >> 0xbf,0) != '\0') ||
                (auVar182 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar182[0x1f] < '\0') {
              auVar135._8_4_ = 0xbf800000;
              auVar135._0_8_ = 0xbf800000bf800000;
              auVar135._12_4_ = 0xbf800000;
              auVar135._16_4_ = 0xbf800000;
              auVar135._20_4_ = 0xbf800000;
              auVar135._24_4_ = 0xbf800000;
              auVar135._28_4_ = 0xbf800000;
              auVar154._8_4_ = 0x40000000;
              auVar154._0_8_ = 0x4000000040000000;
              auVar154._12_4_ = 0x40000000;
              auVar154._16_4_ = 0x40000000;
              auVar154._20_4_ = 0x40000000;
              auVar154._24_4_ = 0x40000000;
              auVar154._28_4_ = 0x40000000;
              auVar12 = vfmadd213ps_fma(local_3c0,auVar154,auVar135);
              local_260 = local_100;
              local_3c0 = ZEXT1632(auVar12);
              auVar182 = local_3c0;
              local_240 = ZEXT1632(auVar12);
              local_220 = local_3a0;
              local_1f0 = local_730;
              uStack_1e8 = uStack_728;
              local_1e0 = local_6b0._0_8_;
              uStack_1d8 = local_6b0._8_8_;
              local_1d0 = local_6c0._0_8_;
              uStack_1c8 = local_6c0._8_8_;
              local_1c0 = local_6d0;
              uStack_1b8 = uStack_6c8;
              pGVar99 = (context->scene->geometries).items[local_788].ptr;
              local_3c0 = auVar182;
              if ((pGVar99->mask & (ray->super_RayK<1>).mask) != 0) {
                auVar184 = vandps_avx(auVar184,auVar159);
                local_520[0] = auVar184;
                fVar141 = (float)local_200;
                local_180[0] = (fVar141 + local_100._0_4_ + 0.0) * (float)local_460;
                local_180[1] = (fVar141 + local_100._4_4_ + 1.0) * local_460._4_4_;
                local_180[2] = (fVar141 + local_100._8_4_ + 2.0) * (float)uStack_458;
                local_180[3] = (fVar141 + local_100._12_4_ + 3.0) * uStack_458._4_4_;
                fStack_170 = (fVar141 + local_100._16_4_ + 4.0) * fStack_450;
                fStack_16c = (fVar141 + local_100._20_4_ + 5.0) * fStack_44c;
                fStack_168 = (fVar141 + local_100._24_4_ + 6.0) * fStack_448;
                fStack_164 = fVar141 + local_100._28_4_ + 7.0;
                local_3c0._0_8_ = auVar12._0_8_;
                local_3c0._8_8_ = auVar12._8_8_;
                local_160 = local_3c0._0_8_;
                uStack_158 = local_3c0._8_8_;
                uStack_150 = 0;
                uStack_148 = 0;
                local_140 = local_3a0;
                auVar136._8_4_ = 0x7f800000;
                auVar136._0_8_ = 0x7f8000007f800000;
                auVar136._12_4_ = 0x7f800000;
                auVar136._16_4_ = 0x7f800000;
                auVar136._20_4_ = 0x7f800000;
                auVar136._24_4_ = 0x7f800000;
                auVar136._28_4_ = 0x7f800000;
                auVar182 = vblendvps_avx(auVar136,local_3a0,auVar184);
                auVar115 = vshufps_avx(auVar182,auVar182,0xb1);
                auVar115 = vminps_avx(auVar182,auVar115);
                auVar132 = vshufpd_avx(auVar115,auVar115,5);
                auVar115 = vminps_avx(auVar115,auVar132);
                auVar132 = vpermpd_avx2(auVar115,0x4e);
                auVar115 = vminps_avx(auVar115,auVar132);
                auVar182 = vcmpps_avx(auVar182,auVar115,0);
                auVar115 = auVar184 & auVar182;
                if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar115 >> 0x7f,0) != '\0') ||
                      (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar115 >> 0xbf,0) != '\0') ||
                    (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar115[0x1f] < '\0') {
                  auVar184 = vandps_avx(auVar182,auVar184);
                }
                uVar93 = vmovmskps_avx(auVar184);
                uVar9 = 0;
                for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                  uVar9 = uVar9 + 1;
                }
                uVar96 = (ulong)uVar9;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar99->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_720 = ZEXT1632(CONCAT124(auVar165._4_12_,local_1fc));
                  local_760 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  local_700._0_8_ = pGVar99;
                  do {
                    local_604 = local_180[uVar96];
                    local_600 = *(undefined4 *)((long)&local_160 + uVar96 * 4);
                    local_780._0_8_ = uVar96;
                    (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar96 * 4);
                    local_690.context = context->user;
                    fVar141 = 1.0 - local_604;
                    auVar165 = ZEXT416((uint)(local_604 * fVar141 * 4.0));
                    auVar12 = vfnmsub213ss_fma(ZEXT416((uint)local_604),ZEXT416((uint)local_604),
                                               auVar165);
                    auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),
                                               auVar165);
                    fVar141 = fVar141 * -fVar141 * 0.5;
                    fVar140 = auVar12._0_4_ * 0.5;
                    fVar119 = auVar165._0_4_ * 0.5;
                    fVar120 = local_604 * local_604 * 0.5;
                    auVar168._0_4_ = fVar120 * (float)local_6d0._0_4_;
                    auVar168._4_4_ = fVar120 * (float)local_6d0._4_4_;
                    auVar168._8_4_ = fVar120 * (float)uStack_6c8;
                    auVar168._12_4_ = fVar120 * uStack_6c8._4_4_;
                    auVar148._4_4_ = fVar119;
                    auVar148._0_4_ = fVar119;
                    auVar148._8_4_ = fVar119;
                    auVar148._12_4_ = fVar119;
                    auVar165 = vfmadd132ps_fma(auVar148,auVar168,local_6c0);
                    auVar169._4_4_ = fVar140;
                    auVar169._0_4_ = fVar140;
                    auVar169._8_4_ = fVar140;
                    auVar169._12_4_ = fVar140;
                    auVar165 = vfmadd132ps_fma(auVar169,auVar165,local_6b0);
                    auVar149._4_4_ = fVar141;
                    auVar149._0_4_ = fVar141;
                    auVar149._8_4_ = fVar141;
                    auVar149._12_4_ = fVar141;
                    auVar88._8_8_ = uStack_728;
                    auVar88._0_8_ = local_730;
                    auVar165 = vfmadd132ps_fma(auVar149,auVar165,auVar88);
                    local_610 = vmovlps_avx(auVar165);
                    local_608 = vextractps_avx(auVar165,2);
                    local_5fc = uVar95;
                    local_5f8 = (int)local_788;
                    local_5f4 = (local_690.context)->instID[0];
                    local_5f0 = (local_690.context)->instPrimID[0];
                    local_78c = -1;
                    local_690.valid = &local_78c;
                    local_690.geometryUserPtr = pGVar99->userPtr;
                    local_690.ray = (RTCRayN *)ray;
                    local_690.hit = (RTCHitN *)&local_610;
                    local_690.N = 1;
                    if (pGVar99->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015c12bb:
                      p_Var10 = context->args->filter;
                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar99->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar209 = ZEXT1664(auVar209._0_16_);
                        (*p_Var10)(&local_690);
                        pGVar99 = (Geometry *)local_700._0_8_;
                        if (*local_690.valid == 0) goto LAB_015c1360;
                      }
                      (((Vec3f *)((long)local_690.ray + 0x30))->field_0).components[0] =
                           *(float *)local_690.hit;
                      (((Vec3f *)((long)local_690.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_690.hit + 4);
                      (((Vec3f *)((long)local_690.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_690.hit + 8);
                      *(float *)((long)local_690.ray + 0x3c) = *(float *)(local_690.hit + 0xc);
                      *(float *)((long)local_690.ray + 0x40) = *(float *)(local_690.hit + 0x10);
                      *(float *)((long)local_690.ray + 0x44) = *(float *)(local_690.hit + 0x14);
                      *(float *)((long)local_690.ray + 0x48) = *(float *)(local_690.hit + 0x18);
                      *(float *)((long)local_690.ray + 0x4c) = *(float *)(local_690.hit + 0x1c);
                      *(float *)((long)local_690.ray + 0x50) = *(float *)(local_690.hit + 0x20);
                    }
                    else {
                      auVar209 = ZEXT1664(auVar209._0_16_);
                      (*pGVar99->intersectionFilterN)(&local_690);
                      pGVar99 = (Geometry *)local_700._0_8_;
                      if (*local_690.valid != 0) goto LAB_015c12bb;
LAB_015c1360:
                      (ray->super_RayK<1>).tfar = (float)local_760._0_4_;
                      pGVar99 = (Geometry *)local_700._0_8_;
                    }
                    *(undefined4 *)(local_520[0] + local_780._0_8_ * 4) = 0;
                    auVar115 = local_520[0];
                    fVar141 = (ray->super_RayK<1>).tfar;
                    auVar117._4_4_ = fVar141;
                    auVar117._0_4_ = fVar141;
                    auVar117._8_4_ = fVar141;
                    auVar117._12_4_ = fVar141;
                    auVar117._16_4_ = fVar141;
                    auVar117._20_4_ = fVar141;
                    auVar117._24_4_ = fVar141;
                    auVar117._28_4_ = fVar141;
                    auVar182 = vcmpps_avx(local_3a0,auVar117,2);
                    auVar184 = vandps_avx(auVar182,local_520[0]);
                    local_520[0] = auVar184;
                    auVar115 = auVar115 & auVar182;
                    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar115 >> 0x7f,0) == '\0') &&
                          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar115 >> 0xbf,0) == '\0') &&
                        (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar115[0x1f]) goto LAB_015c1401;
                    auVar137._8_4_ = 0x7f800000;
                    auVar137._0_8_ = 0x7f8000007f800000;
                    auVar137._12_4_ = 0x7f800000;
                    auVar137._16_4_ = 0x7f800000;
                    auVar137._20_4_ = 0x7f800000;
                    auVar137._24_4_ = 0x7f800000;
                    auVar137._28_4_ = 0x7f800000;
                    auVar182 = vblendvps_avx(auVar137,local_3a0,auVar184);
                    auVar115 = vshufps_avx(auVar182,auVar182,0xb1);
                    auVar115 = vminps_avx(auVar182,auVar115);
                    auVar132 = vshufpd_avx(auVar115,auVar115,5);
                    auVar115 = vminps_avx(auVar115,auVar132);
                    auVar132 = vpermpd_avx2(auVar115,0x4e);
                    auVar115 = vminps_avx(auVar115,auVar132);
                    auVar182 = vcmpps_avx(auVar182,auVar115,0);
                    auVar115 = auVar184 & auVar182;
                    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar115 >> 0x7f,0) != '\0') ||
                          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar115 >> 0xbf,0) != '\0') ||
                        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar115[0x1f] < '\0') {
                      auVar184 = vandps_avx(auVar182,auVar184);
                    }
                    local_760 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    uVar93 = vmovmskps_avx(auVar184);
                    uVar9 = 0;
                    for (; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x80000000) {
                      uVar9 = uVar9 + 1;
                    }
                    uVar96 = (ulong)uVar9;
                  } while( true );
                }
                fVar141 = local_180[uVar96];
                fVar140 = *(float *)((long)&local_160 + uVar96 * 4);
                fVar119 = 1.0 - fVar141;
                auVar165 = ZEXT416((uint)(fVar141 * fVar119 * 4.0));
                auVar12 = vfnmsub213ss_fma(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),auVar165);
                auVar165 = vfmadd213ss_fma(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),auVar165);
                fVar119 = fVar119 * -fVar119 * 0.5;
                fVar120 = auVar12._0_4_ * 0.5;
                fVar121 = auVar165._0_4_ * 0.5;
                fVar122 = fVar141 * fVar141 * 0.5;
                auVar166._0_4_ = fVar122 * (float)local_6d0._0_4_;
                auVar166._4_4_ = fVar122 * (float)local_6d0._4_4_;
                auVar166._8_4_ = fVar122 * (float)uStack_6c8;
                auVar166._12_4_ = fVar122 * uStack_6c8._4_4_;
                auVar146._4_4_ = fVar121;
                auVar146._0_4_ = fVar121;
                auVar146._8_4_ = fVar121;
                auVar146._12_4_ = fVar121;
                auVar165 = vfmadd132ps_fma(auVar146,auVar166,local_6c0);
                auVar167._4_4_ = fVar120;
                auVar167._0_4_ = fVar120;
                auVar167._8_4_ = fVar120;
                auVar167._12_4_ = fVar120;
                auVar165 = vfmadd132ps_fma(auVar167,auVar165,local_6b0);
                auVar147._4_4_ = fVar119;
                auVar147._0_4_ = fVar119;
                auVar147._8_4_ = fVar119;
                auVar147._12_4_ = fVar119;
                auVar87._8_8_ = uStack_728;
                auVar87._0_8_ = local_730;
                auVar165 = vfmadd132ps_fma(auVar147,auVar165,auVar87);
                (ray->super_RayK<1>).tfar = *(float *)(local_140 + uVar96 * 4);
                uVar103 = vmovlps_avx(auVar165);
                *(undefined8 *)&(ray->Ng).field_0 = uVar103;
                fVar119 = (float)vextractps_avx(auVar165,2);
                (ray->Ng).field_0.field_0.z = fVar119;
                ray->u = fVar141;
                ray->v = fVar140;
                ray->primID = uVar95;
                ray->geomID = (uint)local_788;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
              }
            }
          }
        }
        goto LAB_015c10b2;
      }
LAB_015c057e:
      fVar141 = (ray->super_RayK<1>).tfar;
      auVar108._4_4_ = fVar141;
      auVar108._0_4_ = fVar141;
      auVar108._8_4_ = fVar141;
      auVar108._12_4_ = fVar141;
      auVar165 = vcmpps_avx(local_280,auVar108,2);
      uVar95 = vmovmskps_avx(auVar165);
      uVar95 = (uint)uVar100 & uVar95;
    } while (uVar95 != 0);
  }
  return;
LAB_015c1401:
  auVar230 = ZEXT3264(local_560);
  pre = local_6a0;
  pPVar98 = local_698;
  local_1fc = local_720._0_4_;
LAB_015c10b2:
  auVar139 = ZEXT3264(local_5a0);
  lVar101 = lVar101 + 8;
  auVar160 = ZEXT3264(local_540);
  if (local_1fc <= (int)lVar101) goto LAB_015c057e;
  goto LAB_015c064a;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }